

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

void embree::avx512::ConeCurveMiIntersectorK<8,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  ulong uVar75;
  byte bVar76;
  byte bVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  byte bVar88;
  byte bVar89;
  uint uVar90;
  uint uVar91;
  uint uVar92;
  byte bVar93;
  uint uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  float fVar163;
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar164;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar166 [64];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  undefined1 local_5b0 [16];
  size_t local_5a0;
  uint local_594;
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  uint local_500 [4];
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  uint local_4a0 [4];
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  uint local_480 [4];
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  uint local_460 [4];
  uint uStack_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  undefined1 local_440 [16];
  RTCHitN local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  int iVar99;
  int iVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  int iVar137;
  int iVar138;
  int iVar139;
  undefined1 auVar165 [32];
  
  pSVar10 = context->scene;
  pGVar11 = (pSVar10->geometries).items[line->sharedGeomID].ptr;
  uVar94 = (line->v0).field_0.i[0];
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  p_Var13 = pGVar11[1].intersectionFilterN;
  uVar91 = (line->v0).field_0.i[1];
  uVar90 = (line->v0).field_0.i[2];
  uVar92 = (line->v0).field_0.i[3];
  uVar6 = (line->v0).field_0.i[4];
  auVar113._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar6 * (long)p_Var13);
  auVar113._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar94 * (long)p_Var13);
  uVar7 = (line->v0).field_0.i[5];
  auVar131._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar7 * (long)p_Var13);
  auVar131._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar91 * (long)p_Var13);
  uVar8 = (line->v0).field_0.i[6];
  auVar109._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar8 * (long)p_Var13);
  auVar109._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar90 * (long)p_Var13);
  uVar9 = (line->v0).field_0.i[7];
  auVar110._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar9 * (long)p_Var13);
  auVar110._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar92 * (long)p_Var13);
  auVar100 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar6 + 1) * (long)p_Var13);
  auVar124._0_16_ =
       ZEXT116(0) * auVar100 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar94 + 1) * (long)p_Var13);
  auVar124._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar100;
  auVar100 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar7 + 1) * (long)p_Var13);
  auVar151._0_16_ =
       ZEXT116(0) * auVar100 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar91 + 1) * (long)p_Var13);
  auVar151._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar100;
  auVar100 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar8 + 1) * (long)p_Var13);
  auVar153._0_16_ =
       ZEXT116(0) * auVar100 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar90 + 1) * (long)p_Var13);
  auVar153._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar100;
  auVar100 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar9 + 1) * (long)p_Var13);
  auVar155._0_16_ =
       ZEXT116(0) * auVar100 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar92 + 1) * (long)p_Var13);
  auVar155._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar100;
  local_a0 = vpbroadcastd_avx512vl();
  auVar106 = vunpcklps_avx(auVar113,auVar109);
  auVar104 = vunpckhps_avx(auVar113,auVar109);
  auVar113 = vunpcklps_avx(auVar131,auVar110);
  auVar105 = vunpckhps_avx(auVar131,auVar110);
  auVar109 = vunpcklps_avx(auVar106,auVar113);
  auVar113 = vunpckhps_avx(auVar106,auVar113);
  auVar110 = vunpcklps_avx(auVar104,auVar105);
  auVar131 = vunpckhps_avx(auVar104,auVar105);
  auVar106 = vpunpckldq_avx2(auVar124,auVar153);
  auVar104 = vpunpckhdq_avx2(auVar124,auVar153);
  auVar124 = vpunpckldq_avx2(auVar151,auVar155);
  auVar105 = vpunpckhdq_avx2(auVar151,auVar155);
  auVar153 = vpunpckldq_avx2(auVar106,auVar124);
  auVar124 = vpunpckhdq_avx2(auVar106,auVar124);
  auVar155 = vpunpckldq_avx2(auVar104,auVar105);
  auVar151 = vpunpckhdq_avx2(auVar104,auVar105);
  auVar104 = vpcmpeqd_avx2(auVar106,auVar106);
  uVar96 = vpcmpd_avx512vl(auVar104,(undefined1  [32])(line->primIDs).field_0,4);
  fVar1 = *(float *)(ray + k * 4);
  auVar108._4_4_ = fVar1;
  auVar108._0_4_ = fVar1;
  auVar108._8_4_ = fVar1;
  auVar108._12_4_ = fVar1;
  auVar108._16_4_ = fVar1;
  auVar108._20_4_ = fVar1;
  auVar108._24_4_ = fVar1;
  auVar108._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x10);
  auVar111._4_4_ = fVar2;
  auVar111._0_4_ = fVar2;
  auVar111._8_4_ = fVar2;
  auVar111._12_4_ = fVar2;
  auVar111._16_4_ = fVar2;
  auVar111._20_4_ = fVar2;
  auVar111._24_4_ = fVar2;
  auVar111._28_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x20);
  auVar112._4_4_ = fVar3;
  auVar112._0_4_ = fVar3;
  auVar112._8_4_ = fVar3;
  auVar112._12_4_ = fVar3;
  auVar112._16_4_ = fVar3;
  auVar112._20_4_ = fVar3;
  auVar112._24_4_ = fVar3;
  auVar112._28_4_ = fVar3;
  auVar101 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar185 = ZEXT3264(auVar101);
  auVar102 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar186 = ZEXT3264(auVar102);
  auVar103 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar187 = ZEXT3264(auVar103);
  auVar100 = vmulss_avx512f(auVar103._0_16_,auVar103._0_16_);
  auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar102,auVar102);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar101);
  auVar106._0_4_ = auVar104._0_4_;
  auVar106._4_4_ = auVar106._0_4_;
  auVar106._8_4_ = auVar106._0_4_;
  auVar106._12_4_ = auVar106._0_4_;
  auVar106._16_4_ = auVar106._0_4_;
  auVar106._20_4_ = auVar106._0_4_;
  auVar106._24_4_ = auVar106._0_4_;
  auVar106._28_4_ = auVar106._0_4_;
  auVar105 = vrcp14ps_avx512vl(auVar106);
  auVar104._8_4_ = 0x3f800000;
  auVar104._0_8_ = &DAT_3f8000003f800000;
  auVar104._12_4_ = 0x3f800000;
  auVar104._16_4_ = 0x3f800000;
  auVar104._20_4_ = 0x3f800000;
  auVar104._24_4_ = 0x3f800000;
  auVar104._28_4_ = 0x3f800000;
  auVar104 = vfnmadd213ps_avx512vl(auVar106,auVar105,auVar104);
  auVar100 = vfmadd132ps_fma(auVar104,auVar105,auVar105);
  auVar107._0_4_ = auVar109._0_4_ + auVar153._0_4_;
  auVar107._4_4_ = auVar109._4_4_ + auVar153._4_4_;
  auVar107._8_4_ = auVar109._8_4_ + auVar153._8_4_;
  auVar107._12_4_ = auVar109._12_4_ + auVar153._12_4_;
  auVar107._16_4_ = auVar109._16_4_ + auVar153._16_4_;
  auVar107._20_4_ = auVar109._20_4_ + auVar153._20_4_;
  auVar107._24_4_ = auVar109._24_4_ + auVar153._24_4_;
  auVar107._28_4_ = auVar109._28_4_ + auVar153._28_4_;
  auVar114._0_4_ = auVar124._0_4_ + auVar113._0_4_;
  auVar114._4_4_ = auVar124._4_4_ + auVar113._4_4_;
  auVar114._8_4_ = auVar124._8_4_ + auVar113._8_4_;
  auVar114._12_4_ = auVar124._12_4_ + auVar113._12_4_;
  auVar114._16_4_ = auVar124._16_4_ + auVar113._16_4_;
  auVar114._20_4_ = auVar124._20_4_ + auVar113._20_4_;
  auVar114._24_4_ = auVar124._24_4_ + auVar113._24_4_;
  auVar114._28_4_ = auVar124._28_4_ + auVar113._28_4_;
  auVar115._0_4_ = auVar110._0_4_ + auVar155._0_4_;
  auVar115._4_4_ = auVar110._4_4_ + auVar155._4_4_;
  auVar115._8_4_ = auVar110._8_4_ + auVar155._8_4_;
  auVar115._12_4_ = auVar110._12_4_ + auVar155._12_4_;
  auVar115._16_4_ = auVar110._16_4_ + auVar155._16_4_;
  auVar115._20_4_ = auVar110._20_4_ + auVar155._20_4_;
  auVar115._24_4_ = auVar110._24_4_ + auVar155._24_4_;
  auVar115._28_4_ = auVar110._28_4_ + auVar155._28_4_;
  auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar105 = vmulps_avx512vl(auVar107,auVar104);
  auVar106 = vmulps_avx512vl(auVar114,auVar104);
  auVar107 = vmulps_avx512vl(auVar115,auVar104);
  auVar104 = vsubps_avx(auVar105,auVar108);
  auVar105 = vsubps_avx(auVar106,auVar111);
  auVar106 = vsubps_avx(auVar107,auVar112);
  auVar106 = vmulps_avx512vl(auVar106,auVar103);
  auVar105 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar105);
  auVar104 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar104);
  auVar140._0_4_ = auVar104._0_4_ * auVar100._0_4_;
  auVar140._4_4_ = auVar104._4_4_ * auVar100._4_4_;
  auVar140._8_4_ = auVar104._8_4_ * auVar100._8_4_;
  auVar140._12_4_ = auVar104._12_4_ * auVar100._12_4_;
  auVar140._16_4_ = auVar104._16_4_ * 0.0;
  auVar140._20_4_ = auVar104._20_4_ * 0.0;
  auVar140._24_4_ = auVar104._24_4_ * 0.0;
  auVar140._28_4_ = 0;
  auVar104 = vmulps_avx512vl(auVar101,auVar140);
  auVar105 = vmulps_avx512vl(auVar102,auVar140);
  auVar106 = vmulps_avx512vl(auVar103,auVar140);
  auVar118._0_4_ = auVar104._0_4_ + fVar1;
  auVar118._4_4_ = auVar104._4_4_ + fVar1;
  auVar118._8_4_ = auVar104._8_4_ + fVar1;
  auVar118._12_4_ = auVar104._12_4_ + fVar1;
  auVar118._16_4_ = auVar104._16_4_ + fVar1;
  auVar118._20_4_ = auVar104._20_4_ + fVar1;
  auVar118._24_4_ = auVar104._24_4_ + fVar1;
  auVar118._28_4_ = auVar104._28_4_ + fVar1;
  auVar119._0_4_ = auVar105._0_4_ + fVar2;
  auVar119._4_4_ = auVar105._4_4_ + fVar2;
  auVar119._8_4_ = auVar105._8_4_ + fVar2;
  auVar119._12_4_ = auVar105._12_4_ + fVar2;
  auVar119._16_4_ = auVar105._16_4_ + fVar2;
  auVar119._20_4_ = auVar105._20_4_ + fVar2;
  auVar119._24_4_ = auVar105._24_4_ + fVar2;
  auVar119._28_4_ = auVar105._28_4_ + fVar2;
  auVar120._0_4_ = fVar3 + auVar106._0_4_;
  auVar120._4_4_ = fVar3 + auVar106._4_4_;
  auVar120._8_4_ = fVar3 + auVar106._8_4_;
  auVar120._12_4_ = fVar3 + auVar106._12_4_;
  auVar120._16_4_ = fVar3 + auVar106._16_4_;
  auVar120._20_4_ = fVar3 + auVar106._20_4_;
  auVar120._24_4_ = fVar3 + auVar106._24_4_;
  auVar120._28_4_ = fVar3 + auVar106._28_4_;
  auVar106 = vsubps_avx512vl(auVar153,auVar109);
  auVar190 = ZEXT3264(auVar106);
  auVar107 = vsubps_avx512vl(auVar124,auVar113);
  auVar188 = ZEXT3264(auVar107);
  auVar108 = vsubps_avx512vl(auVar155,auVar110);
  auVar189 = ZEXT3264(auVar108);
  _local_560 = vsubps_avx(auVar118,auVar109);
  _local_520 = vsubps_avx512vl(auVar119,auVar113);
  auVar109 = vsubps_avx512vl(auVar120,auVar110);
  auVar193 = ZEXT3264(auVar109);
  auVar104 = vmulps_avx512vl(auVar108,auVar108);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar107);
  auVar110 = vfmadd231ps_avx512vl(auVar104,auVar106,auVar106);
  auVar104 = vmulps_avx512vl(auVar108,auVar109);
  auVar104 = vfmadd231ps_avx512vl(auVar104,_local_520,auVar107);
  auVar111 = vfmadd231ps_avx512vl(auVar104,_local_560,auVar106);
  auVar104 = vmulps_avx512vl(auVar108,auVar103);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar107);
  auVar112 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar106);
  auVar104 = vsubps_avx(auVar131,auVar151);
  fVar1 = auVar104._0_4_;
  fVar3 = auVar104._4_4_;
  fVar56 = auVar104._8_4_;
  fVar59 = auVar104._12_4_;
  fVar62 = auVar104._16_4_;
  fVar65 = auVar104._20_4_;
  fVar68 = auVar104._24_4_;
  auVar144._0_4_ = fVar1 * fVar1 + auVar110._0_4_;
  auVar144._4_4_ = fVar3 * fVar3 + auVar110._4_4_;
  auVar144._8_4_ = fVar56 * fVar56 + auVar110._8_4_;
  auVar144._12_4_ = fVar59 * fVar59 + auVar110._12_4_;
  auVar144._16_4_ = fVar62 * fVar62 + auVar110._16_4_;
  auVar144._20_4_ = fVar65 * fVar65 + auVar110._20_4_;
  auVar144._24_4_ = fVar68 * fVar68 + auVar110._24_4_;
  auVar144._28_4_ = auVar113._28_4_ + auVar110._28_4_;
  auVar105 = vmulps_avx512vl(auVar103,auVar109);
  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,_local_520);
  auVar113 = vfmadd231ps_avx512vl(auVar105,auVar101,_local_560);
  auVar105 = vmulps_avx512vl(auVar109,auVar109);
  auVar105 = vfmadd231ps_avx512vl(auVar105,_local_520,_local_520);
  auVar114 = vfmadd231ps_avx512vl(auVar105,_local_560,_local_560);
  auVar115 = vmulps_avx512vl(auVar110,auVar110);
  auVar194 = ZEXT3264(auVar115);
  auVar116 = vmulps_avx512vl(auVar131,auVar110);
  fVar2 = auVar112._0_4_;
  fVar164 = fVar2 * fVar2;
  fVar54 = auVar112._4_4_;
  fVar167 = fVar54 * fVar54;
  auVar105._4_4_ = fVar167;
  auVar105._0_4_ = fVar164;
  fVar57 = auVar112._8_4_;
  fVar168 = fVar57 * fVar57;
  auVar105._8_4_ = fVar168;
  fVar60 = auVar112._12_4_;
  fVar169 = fVar60 * fVar60;
  auVar105._12_4_ = fVar169;
  fVar63 = auVar112._16_4_;
  fVar170 = fVar63 * fVar63;
  auVar105._16_4_ = fVar170;
  fVar66 = auVar112._20_4_;
  fVar171 = fVar66 * fVar66;
  auVar105._20_4_ = fVar171;
  fVar69 = auVar112._24_4_;
  fVar172 = fVar69 * fVar69;
  auVar105._24_4_ = fVar172;
  auVar105._28_4_ = local_560._28_4_;
  auVar105 = vmulps_avx512vl(auVar144,auVar105);
  auVar105 = vsubps_avx512vl(auVar115,auVar105);
  auVar113 = vmulps_avx512vl(auVar115,auVar113);
  auVar117 = vmulps_avx512vl(auVar112,auVar111);
  auVar117 = vmulps_avx512vl(auVar144,auVar117);
  auVar113 = vsubps_avx512vl(auVar113,auVar117);
  auVar117 = vmulps_avx512vl(auVar104,auVar112);
  auVar117 = vmulps_avx512vl(auVar116,auVar117);
  auVar113 = vaddps_avx512vl(auVar117,auVar113);
  auVar114 = vmulps_avx512vl(auVar115,auVar114);
  auVar117 = vmulps_avx512vl(auVar111,auVar111);
  auVar117 = vmulps_avx512vl(auVar144,auVar117);
  auVar114 = vsubps_avx512vl(auVar114,auVar117);
  auVar104 = vaddps_avx512vl(auVar104,auVar104);
  auVar104 = vmulps_avx512vl(auVar104,auVar111);
  auVar104 = vsubps_avx512vl(auVar104,auVar116);
  auVar104 = vmulps_avx512vl(auVar116,auVar104);
  auVar104 = vaddps_avx512vl(auVar114,auVar104);
  auVar114 = vmulps_avx512vl(auVar113,auVar113);
  auVar104 = vmulps_avx512vl(auVar105,auVar104);
  auVar104 = vsubps_avx512vl(auVar114,auVar104);
  auVar114 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  uVar97 = vcmpps_avx512vl(auVar104,auVar114,5);
  bVar89 = (byte)(uVar96 & uVar97);
  if (bVar89 != 0) {
    auVar153 = vsubps_avx(auVar118,auVar153);
    auVar124 = vsubps_avx(auVar119,auVar124);
    auVar155 = vsubps_avx(auVar120,auVar155);
    auVar118 = vsqrtps_avx512vl(auVar104);
    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar104 = vrcp14ps_avx512vl(auVar105);
    auVar120 = vfnmadd213ps_avx512vl(auVar104,auVar105,auVar119);
    auVar116._8_4_ = 0x7fffffff;
    auVar116._0_8_ = 0x7fffffff7fffffff;
    auVar116._12_4_ = 0x7fffffff;
    auVar116._16_4_ = 0x7fffffff;
    auVar116._20_4_ = 0x7fffffff;
    auVar116._24_4_ = 0x7fffffff;
    auVar116._28_4_ = 0x7fffffff;
    vandps_avx512vl(auVar105,auVar116);
    auVar117._8_4_ = 0x219392ef;
    auVar117._0_8_ = 0x219392ef219392ef;
    auVar117._12_4_ = 0x219392ef;
    auVar117._16_4_ = 0x219392ef;
    auVar117._20_4_ = 0x219392ef;
    auVar117._24_4_ = 0x219392ef;
    auVar117._28_4_ = 0x219392ef;
    uVar95 = vcmpps_avx512vl(auVar120,auVar117,2);
    auVar105 = vfmadd132ps_avx512vl(auVar120,auVar104,auVar104);
    auVar152._8_4_ = 0x80000000;
    auVar152._0_8_ = 0x8000000080000000;
    auVar152._12_4_ = 0x80000000;
    auVar152._16_4_ = 0x80000000;
    auVar152._20_4_ = 0x80000000;
    auVar152._24_4_ = 0x80000000;
    auVar152._28_4_ = 0x80000000;
    auVar104 = vxorps_avx512vl(auVar113,auVar152);
    auVar104 = vsubps_avx(auVar104,auVar118);
    auVar104 = vmulps_avx512vl(auVar104,auVar105);
    auVar175._8_4_ = 0xff800000;
    auVar175._0_8_ = 0xff800000ff800000;
    auVar175._12_4_ = 0xff800000;
    auVar175._16_4_ = 0xff800000;
    auVar175._20_4_ = 0xff800000;
    auVar175._24_4_ = 0xff800000;
    auVar175._28_4_ = 0xff800000;
    bVar14 = (bool)((byte)uVar95 & 1);
    auVar121._0_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._0_4_;
    bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
    auVar121._4_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._4_4_;
    bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
    auVar121._8_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._8_4_;
    bVar14 = (bool)((byte)(uVar95 >> 3) & 1);
    auVar121._12_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._12_4_;
    bVar14 = (bool)((byte)(uVar95 >> 4) & 1);
    auVar121._16_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._16_4_;
    bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
    auVar121._20_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._20_4_;
    bVar14 = (bool)((byte)(uVar95 >> 6) & 1);
    auVar121._24_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._24_4_;
    bVar14 = SUB81(uVar95 >> 7,0);
    auVar121._28_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._28_4_;
    auVar104 = vsubps_avx512vl(auVar118,auVar113);
    auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar184 = ZEXT3264(auVar116);
    auVar104 = vmulps_avx512vl(auVar104,auVar105);
    bVar14 = (bool)((byte)uVar95 & 1);
    iVar99 = auVar116._0_4_;
    auVar122._0_4_ = (uint)bVar14 * iVar99 | (uint)!bVar14 * auVar104._0_4_;
    bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
    iVar133 = auVar116._4_4_;
    auVar122._4_4_ = (uint)bVar14 * iVar133 | (uint)!bVar14 * auVar104._4_4_;
    bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
    iVar134 = auVar116._8_4_;
    auVar122._8_4_ = (uint)bVar14 * iVar134 | (uint)!bVar14 * auVar104._8_4_;
    bVar14 = (bool)((byte)(uVar95 >> 3) & 1);
    iVar135 = auVar116._12_4_;
    auVar122._12_4_ = (uint)bVar14 * iVar135 | (uint)!bVar14 * auVar104._12_4_;
    bVar14 = (bool)((byte)(uVar95 >> 4) & 1);
    iVar136 = auVar116._16_4_;
    auVar122._16_4_ = (uint)bVar14 * iVar136 | (uint)!bVar14 * auVar104._16_4_;
    bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
    iVar137 = auVar116._20_4_;
    auVar122._20_4_ = (uint)bVar14 * iVar137 | (uint)!bVar14 * auVar104._20_4_;
    bVar14 = (bool)((byte)(uVar95 >> 6) & 1);
    iVar138 = auVar116._24_4_;
    iVar139 = auVar116._28_4_;
    auVar122._24_4_ = (uint)bVar14 * iVar138 | (uint)!bVar14 * auVar104._24_4_;
    bVar14 = SUB81(uVar95 >> 7,0);
    auVar122._28_4_ = (uint)bVar14 * iVar139 | (uint)!bVar14 * auVar104._28_4_;
    auVar104 = vmulps_avx512vl(auVar112,auVar121);
    auVar173._0_4_ = auVar111._0_4_ + auVar104._0_4_;
    auVar173._4_4_ = auVar111._4_4_ + auVar104._4_4_;
    auVar173._8_4_ = auVar111._8_4_ + auVar104._8_4_;
    auVar173._12_4_ = auVar111._12_4_ + auVar104._12_4_;
    auVar173._16_4_ = auVar111._16_4_ + auVar104._16_4_;
    auVar173._20_4_ = auVar111._20_4_ + auVar104._20_4_;
    auVar173._24_4_ = auVar111._24_4_ + auVar104._24_4_;
    fVar163 = auVar111._28_4_;
    auVar173._28_4_ = fVar163 + auVar104._28_4_;
    auVar104 = vmulps_avx512vl(auVar112,auVar122);
    auVar117 = vaddps_avx512vl(auVar111,auVar104);
    auVar192 = ZEXT3264(auVar117);
    uVar71 = vcmpps_avx512vl(auVar173,auVar110,1);
    uVar72 = vcmpps_avx512vl(auVar173,auVar114,6);
    uVar73 = vcmpps_avx512vl(auVar117,auVar110,1);
    uVar74 = vcmpps_avx512vl(auVar117,auVar114,6);
    auVar166._0_4_ = fVar2 * (float)local_560._0_4_;
    auVar166._4_4_ = fVar54 * (float)local_560._4_4_;
    auVar166._8_4_ = fVar57 * fStack_558;
    auVar166._12_4_ = fVar60 * fStack_554;
    auVar166._16_4_ = fVar63 * fStack_550;
    auVar166._20_4_ = fVar66 * fStack_54c;
    auVar166._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
    auVar166._24_4_ = fVar69 * fStack_548;
    auVar104 = vmulps_avx512vl(auVar112,_local_520);
    auVar105 = vmulps_avx512vl(auVar112,auVar109);
    auVar113 = vmulps_avx512vl(auVar101,auVar111);
    auVar113 = vsubps_avx512vl(auVar166._0_32_,auVar113);
    auVar114 = vmulps_avx512vl(auVar102,auVar111);
    auVar104 = vsubps_avx512vl(auVar104,auVar114);
    auVar114 = vmulps_avx512vl(auVar103,auVar111);
    auVar105 = vsubps_avx512vl(auVar105,auVar114);
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,auVar113);
    fVar53 = auVar131._0_4_;
    fVar55 = auVar131._4_4_;
    fVar58 = auVar131._8_4_;
    fVar61 = auVar131._12_4_;
    fVar64 = auVar131._16_4_;
    fVar67 = auVar131._20_4_;
    fVar70 = auVar131._24_4_;
    auVar81._4_4_ = fVar55 * fVar55 * fVar167;
    auVar81._0_4_ = fVar53 * fVar53 * fVar164;
    auVar81._8_4_ = fVar58 * fVar58 * fVar168;
    auVar81._12_4_ = fVar61 * fVar61 * fVar169;
    auVar81._16_4_ = fVar64 * fVar64 * fVar170;
    auVar81._20_4_ = fVar67 * fVar67 * fVar171;
    auVar81._24_4_ = fVar70 * fVar70 * fVar172;
    auVar81._28_4_ = auVar113._28_4_;
    uVar95 = vcmpps_avx512vl(auVar104,auVar81,1);
    uVar95 = (bVar89 & ~(byte)line->leftExists) & uVar95;
    auVar104 = vrcp14ps_avx512vl(auVar112);
    auVar105 = vfnmadd213ps_avx512vl(auVar104,auVar112,auVar119);
    auVar114 = vfmadd132ps_avx512vl(auVar105,auVar104,auVar104);
    auVar157._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
    auVar157._8_4_ = -auVar111._8_4_;
    auVar157._12_4_ = -auVar111._12_4_;
    auVar157._16_4_ = -auVar111._16_4_;
    auVar157._20_4_ = -auVar111._20_4_;
    auVar157._24_4_ = -auVar111._24_4_;
    auVar157._28_4_ = -fVar163;
    auVar104 = vmulps_avx512vl(auVar114,auVar157);
    bVar14 = (bool)((byte)uVar95 & 1);
    auVar123._0_4_ = (uint)bVar14 * auVar104._0_4_ | (uint)!bVar14 * iVar99;
    bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
    auVar123._4_4_ = (uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * iVar133;
    bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
    auVar123._8_4_ = (uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * iVar134;
    bVar14 = (bool)((byte)(uVar95 >> 3) & 1);
    auVar123._12_4_ = (uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * iVar135;
    bVar14 = (bool)((byte)(uVar95 >> 4) & 1);
    auVar123._16_4_ = (uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * iVar136;
    bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
    auVar123._20_4_ = (uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * iVar137;
    bVar14 = (bool)((byte)(uVar95 >> 6) & 1);
    auVar123._24_4_ = (uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * iVar138;
    bVar14 = SUB81(uVar95 >> 7,0);
    auVar123._28_4_ = (uint)bVar14 * auVar104._28_4_ | (uint)!bVar14 * iVar139;
    auVar183 = ZEXT3264(auVar123);
    auVar104 = vmulps_avx512vl(auVar108,auVar155);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar124,auVar107);
    auVar111 = vfmadd231ps_avx512vl(auVar104,auVar153,auVar106);
    auVar82._4_4_ = auVar153._4_4_ * fVar54;
    auVar82._0_4_ = auVar153._0_4_ * fVar2;
    auVar82._8_4_ = auVar153._8_4_ * fVar57;
    auVar82._12_4_ = auVar153._12_4_ * fVar60;
    auVar82._16_4_ = auVar153._16_4_ * fVar63;
    auVar82._20_4_ = auVar153._20_4_ * fVar66;
    auVar82._24_4_ = auVar153._24_4_ * fVar69;
    auVar82._28_4_ = fVar163;
    auVar83._4_4_ = auVar124._4_4_ * fVar54;
    auVar83._0_4_ = auVar124._0_4_ * fVar2;
    auVar83._8_4_ = auVar124._8_4_ * fVar57;
    auVar83._12_4_ = auVar124._12_4_ * fVar60;
    auVar83._16_4_ = auVar124._16_4_ * fVar63;
    auVar83._20_4_ = auVar124._20_4_ * fVar66;
    auVar83._24_4_ = auVar124._24_4_ * fVar69;
    auVar83._28_4_ = auVar153._28_4_;
    auVar84._4_4_ = auVar155._4_4_ * fVar54;
    auVar84._0_4_ = auVar155._0_4_ * fVar2;
    auVar84._8_4_ = auVar155._8_4_ * fVar57;
    auVar84._12_4_ = auVar155._12_4_ * fVar60;
    auVar84._16_4_ = auVar155._16_4_ * fVar63;
    auVar84._20_4_ = auVar155._20_4_ * fVar66;
    auVar84._24_4_ = auVar155._24_4_ * fVar69;
    auVar84._28_4_ = auVar112._28_4_;
    auVar104 = vmulps_avx512vl(auVar101,auVar111);
    auVar104 = vsubps_avx(auVar82,auVar104);
    auVar105 = vmulps_avx512vl(auVar102,auVar111);
    auVar105 = vsubps_avx(auVar83,auVar105);
    auVar124 = vmulps_avx512vl(auVar103,auVar111);
    auVar113 = vsubps_avx(auVar84,auVar124);
    auVar85._4_4_ = auVar113._4_4_ * auVar113._4_4_;
    auVar85._0_4_ = auVar113._0_4_ * auVar113._0_4_;
    auVar85._8_4_ = auVar113._8_4_ * auVar113._8_4_;
    auVar85._12_4_ = auVar113._12_4_ * auVar113._12_4_;
    auVar85._16_4_ = auVar113._16_4_ * auVar113._16_4_;
    auVar85._20_4_ = auVar113._20_4_ * auVar113._20_4_;
    auVar85._24_4_ = auVar113._24_4_ * auVar113._24_4_;
    auVar85._28_4_ = auVar113._28_4_;
    auVar100 = vfmadd231ps_fma(auVar85,auVar105,auVar105);
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar104,auVar104);
    auVar86._4_4_ = fVar167 * auVar151._4_4_ * auVar151._4_4_;
    auVar86._0_4_ = fVar164 * auVar151._0_4_ * auVar151._0_4_;
    auVar86._8_4_ = fVar168 * auVar151._8_4_ * auVar151._8_4_;
    auVar86._12_4_ = fVar169 * auVar151._12_4_ * auVar151._12_4_;
    auVar86._16_4_ = fVar170 * auVar151._16_4_ * auVar151._16_4_;
    auVar86._20_4_ = fVar171 * auVar151._20_4_ * auVar151._20_4_;
    auVar86._24_4_ = fVar172 * auVar151._24_4_ * auVar151._24_4_;
    auVar86._28_4_ = auVar151._28_4_;
    uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar161._4_4_ = uVar4;
    auVar161._0_4_ = uVar4;
    auVar161._8_4_ = uVar4;
    auVar161._12_4_ = uVar4;
    auVar161._16_4_ = uVar4;
    auVar161._20_4_ = uVar4;
    auVar161._24_4_ = uVar4;
    auVar161._28_4_ = uVar4;
    bVar88 = (byte)uVar71 & (byte)uVar72 & bVar89;
    auVar104 = vblendmps_avx512vl(auVar116,auVar121);
    auVar125._0_4_ =
         (uint)(bVar88 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar105._0_4_;
    bVar14 = (bool)(bVar88 >> 1 & 1);
    auVar125._4_4_ = (uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * auVar105._4_4_;
    bVar14 = (bool)(bVar88 >> 2 & 1);
    auVar125._8_4_ = (uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * auVar105._8_4_;
    bVar14 = (bool)(bVar88 >> 3 & 1);
    auVar125._12_4_ = (uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * auVar105._12_4_;
    bVar14 = (bool)(bVar88 >> 4 & 1);
    auVar125._16_4_ = (uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * auVar105._16_4_;
    bVar14 = (bool)(bVar88 >> 5 & 1);
    auVar125._20_4_ = (uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * auVar105._20_4_;
    bVar14 = (bool)(bVar88 >> 6 & 1);
    auVar125._24_4_ = (uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * auVar105._24_4_;
    auVar125._28_4_ =
         (uint)(bVar88 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar88 >> 7) * auVar105._28_4_;
    auVar177 = ZEXT3264(auVar125);
    bVar88 = (byte)uVar73 & (byte)uVar74 & bVar89;
    auVar104 = vblendmps_avx512vl(auVar175,auVar122);
    auVar126._0_4_ =
         (uint)(bVar88 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar124._0_4_;
    bVar14 = (bool)(bVar88 >> 1 & 1);
    auVar126._4_4_ = (uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * auVar124._4_4_;
    bVar14 = (bool)(bVar88 >> 2 & 1);
    auVar126._8_4_ = (uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * auVar124._8_4_;
    bVar14 = (bool)(bVar88 >> 3 & 1);
    auVar126._12_4_ = (uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * auVar124._12_4_;
    bVar14 = (bool)(bVar88 >> 4 & 1);
    auVar126._16_4_ = (uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * auVar124._16_4_;
    bVar14 = (bool)(bVar88 >> 5 & 1);
    auVar126._20_4_ = (uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * auVar124._20_4_;
    bVar14 = (bool)(bVar88 >> 6 & 1);
    auVar126._24_4_ = (uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * auVar124._24_4_;
    auVar126._28_4_ =
         (uint)(bVar88 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar88 >> 7) * auVar124._28_4_;
    auVar178 = ZEXT3264(auVar126);
    auVar158._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
    auVar158._8_4_ = auVar111._8_4_ ^ 0x80000000;
    auVar158._12_4_ = auVar111._12_4_ ^ 0x80000000;
    auVar158._16_4_ = auVar111._16_4_ ^ 0x80000000;
    auVar158._20_4_ = auVar111._20_4_ ^ 0x80000000;
    auVar158._24_4_ = auVar111._24_4_ ^ 0x80000000;
    auVar158._28_4_ = auVar111._28_4_ ^ 0x80000000;
    uVar95 = vcmpps_avx512vl(ZEXT1632(auVar100),auVar86,1);
    uVar95 = (bVar89 & ~(byte)line->rightExists) & uVar95;
    auVar104 = vmulps_avx512vl(auVar114,auVar158);
    bVar14 = (bool)((byte)uVar95 & 1);
    auVar127._0_4_ = (uint)bVar14 * auVar104._0_4_ | (uint)!bVar14 * iVar99;
    bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
    auVar127._4_4_ = (uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * iVar133;
    bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
    auVar127._8_4_ = (uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * iVar134;
    bVar14 = (bool)((byte)(uVar95 >> 3) & 1);
    auVar127._12_4_ = (uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * iVar135;
    bVar14 = (bool)((byte)(uVar95 >> 4) & 1);
    auVar127._16_4_ = (uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * iVar136;
    bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
    auVar127._20_4_ = (uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * iVar137;
    bVar14 = (bool)((byte)(uVar95 >> 6) & 1);
    auVar127._24_4_ = (uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * iVar138;
    bVar14 = SUB81(uVar95 >> 7,0);
    auVar127._28_4_ = (uint)bVar14 * auVar104._28_4_ | (uint)!bVar14 * iVar139;
    auVar104 = vminps_avx512vl(auVar123,auVar127);
    auVar113 = vmaxps_avx512vl(auVar123,auVar127);
    auVar105 = vminps_avx(auVar125,auVar104);
    uVar95 = vcmpps_avx512vl(auVar105,auVar104,0);
    uVar75 = vcmpps_avx512vl(auVar113,auVar116,0);
    bVar14 = (bool)((byte)uVar75 & 1);
    bVar17 = (bool)((byte)(uVar75 >> 1) & 1);
    bVar19 = (bool)((byte)(uVar75 >> 2) & 1);
    bVar21 = (bool)((byte)(uVar75 >> 3) & 1);
    bVar23 = (bool)((byte)(uVar75 >> 4) & 1);
    bVar30 = (bool)((byte)(uVar75 >> 5) & 1);
    bVar38 = (bool)((byte)(uVar75 >> 6) & 1);
    bVar47 = SUB81(uVar75 >> 7,0);
    uVar75 = vcmpps_avx512vl(auVar104,auVar116,0);
    bVar15 = (bool)((byte)uVar75 & 1);
    bVar18 = (bool)((byte)(uVar75 >> 1) & 1);
    bVar20 = (bool)((byte)(uVar75 >> 2) & 1);
    bVar22 = (bool)((byte)(uVar75 >> 3) & 1);
    bVar24 = (bool)((byte)(uVar75 >> 4) & 1);
    bVar31 = (bool)((byte)(uVar75 >> 5) & 1);
    bVar39 = (bool)((byte)(uVar75 >> 6) & 1);
    bVar48 = SUB81(uVar75 >> 7,0);
    bVar16 = (bool)((byte)uVar95 & 1);
    auVar128._0_4_ =
         (uint)bVar16 * ((uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar113._0_4_) |
         (uint)!bVar16 * ((uint)bVar15 * -0x800000 | (uint)!bVar15 * auVar104._0_4_);
    bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
    auVar128._4_4_ =
         (uint)bVar14 * ((uint)bVar17 * -0x800000 | (uint)!bVar17 * auVar113._4_4_) |
         (uint)!bVar14 * ((uint)bVar18 * -0x800000 | (uint)!bVar18 * auVar104._4_4_);
    bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
    auVar128._8_4_ =
         (uint)bVar14 * ((uint)bVar19 * -0x800000 | (uint)!bVar19 * auVar113._8_4_) |
         (uint)!bVar14 * ((uint)bVar20 * -0x800000 | (uint)!bVar20 * auVar104._8_4_);
    bVar14 = (bool)((byte)(uVar95 >> 3) & 1);
    auVar128._12_4_ =
         (uint)bVar14 * ((uint)bVar21 * -0x800000 | (uint)!bVar21 * auVar113._12_4_) |
         (uint)!bVar14 * ((uint)bVar22 * -0x800000 | (uint)!bVar22 * auVar104._12_4_);
    bVar14 = (bool)((byte)(uVar95 >> 4) & 1);
    auVar128._16_4_ =
         (uint)bVar14 * ((uint)bVar23 * -0x800000 | (uint)!bVar23 * auVar113._16_4_) |
         (uint)!bVar14 * ((uint)bVar24 * -0x800000 | (uint)!bVar24 * auVar104._16_4_);
    bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
    auVar128._20_4_ =
         (uint)bVar14 * ((uint)bVar30 * -0x800000 | (uint)!bVar30 * auVar113._20_4_) |
         (uint)!bVar14 * ((uint)bVar31 * -0x800000 | (uint)!bVar31 * auVar104._20_4_);
    bVar14 = (bool)((byte)(uVar95 >> 6) & 1);
    auVar128._24_4_ =
         (uint)bVar14 * ((uint)bVar38 * -0x800000 | (uint)!bVar38 * auVar113._24_4_) |
         (uint)!bVar14 * ((uint)bVar39 * -0x800000 | (uint)!bVar39 * auVar104._24_4_);
    bVar14 = SUB81(uVar95 >> 7,0);
    auVar128._28_4_ =
         (uint)bVar14 * ((uint)bVar47 * -0x800000 | (uint)!bVar47 * auVar113._28_4_) |
         (uint)!bVar14 * ((uint)bVar48 * -0x800000 | (uint)!bVar48 * auVar104._28_4_);
    auVar104 = vmaxps_avx(auVar126,auVar128);
    auVar179 = ZEXT3264(auVar104);
    auVar156._0_4_ = auVar140._0_4_ + auVar105._0_4_;
    auVar156._4_4_ = auVar140._4_4_ + auVar105._4_4_;
    auVar156._8_4_ = auVar140._8_4_ + auVar105._8_4_;
    auVar156._12_4_ = auVar140._12_4_ + auVar105._12_4_;
    auVar156._16_4_ = auVar140._16_4_ + auVar105._16_4_;
    auVar156._20_4_ = auVar140._20_4_ + auVar105._20_4_;
    auVar156._24_4_ = auVar140._24_4_ + auVar105._24_4_;
    auVar156._28_4_ = auVar105._28_4_ + 0.0;
    uVar95 = vcmpps_avx512vl(auVar161,auVar156,2);
    uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar159._4_4_ = uVar4;
    auVar159._0_4_ = uVar4;
    auVar159._8_4_ = uVar4;
    auVar159._12_4_ = uVar4;
    auVar159._16_4_ = uVar4;
    auVar159._20_4_ = uVar4;
    auVar159._24_4_ = uVar4;
    auVar159._28_4_ = uVar4;
    uVar75 = vcmpps_avx512vl(auVar156,auVar159,2);
    auVar165._0_4_ = auVar104._0_4_ + auVar140._0_4_;
    auVar165._4_4_ = auVar104._4_4_ + auVar140._4_4_;
    auVar165._8_4_ = auVar104._8_4_ + auVar140._8_4_;
    auVar165._12_4_ = auVar104._12_4_ + auVar140._12_4_;
    auVar165._16_4_ = auVar104._16_4_ + auVar140._16_4_;
    auVar165._20_4_ = auVar104._20_4_ + auVar140._20_4_;
    auVar165._24_4_ = auVar104._24_4_ + auVar140._24_4_;
    auVar165._28_4_ = auVar104._28_4_ + 0.0;
    auVar166 = ZEXT3264(auVar165);
    uVar71 = vcmpps_avx512vl(auVar161,auVar165,2);
    uVar72 = vcmpps_avx512vl(auVar165,auVar159,2);
    uVar73 = vcmpps_avx512vl(auVar104,auVar175,4);
    bVar93 = (byte)uVar71 & (byte)uVar72 & (byte)uVar73;
    uVar98 = vcmpps_avx512vl(auVar105,auVar116,4);
    uVar98 = uVar95 & uVar75 & uVar98;
    bVar88 = (byte)uVar98 & bVar89;
    bVar77 = bVar89 & ((byte)uVar98 | bVar93);
    uVar94 = (uint)bVar77;
    if (bVar77 != 0) {
      auVar104 = vblendmps_avx512vl(auVar104,auVar105);
      auVar129._0_4_ =
           (float)((uint)(bVar88 & 1) * auVar104._0_4_ |
                  (uint)!(bool)(bVar88 & 1) * (int)auVar156._0_4_);
      bVar14 = (bool)(bVar88 >> 1 & 1);
      auVar129._4_4_ = (float)((uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * (int)auVar156._4_4_);
      bVar14 = (bool)(bVar88 >> 2 & 1);
      auVar129._8_4_ = (float)((uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * (int)auVar156._8_4_);
      bVar14 = (bool)(bVar88 >> 3 & 1);
      auVar129._12_4_ =
           (float)((uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * (int)auVar156._12_4_);
      bVar14 = (bool)(bVar88 >> 4 & 1);
      auVar129._16_4_ =
           (float)((uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * (int)auVar156._16_4_);
      bVar14 = (bool)(bVar88 >> 5 & 1);
      auVar129._20_4_ =
           (float)((uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * (int)auVar156._20_4_);
      bVar14 = (bool)(bVar88 >> 6 & 1);
      auVar129._24_4_ =
           (float)((uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * (int)auVar156._24_4_);
      auVar129._28_4_ =
           (float)((uint)(bVar88 >> 7) * auVar104._28_4_ |
                  (uint)!(bool)(bVar88 >> 7) * (int)auVar156._28_4_);
      auVar104 = vblendmps_avx512vl(auVar117,auVar173);
      auVar130._0_4_ =
           (float)((uint)(bVar88 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar88 & 1) * -0x800000);
      bVar14 = (bool)(bVar88 >> 1 & 1);
      auVar130._4_4_ = (float)((uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar88 >> 2 & 1);
      auVar130._8_4_ = (float)((uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar88 >> 3 & 1);
      auVar130._12_4_ = (float)((uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar88 >> 4 & 1);
      auVar130._16_4_ = (float)((uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar88 >> 5 & 1);
      auVar130._20_4_ = (float)((uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar88 >> 6 & 1);
      auVar130._24_4_ = (float)((uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * -0x800000);
      auVar130._28_4_ =
           (uint)(bVar88 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar88 >> 7) * -0x800000;
      auVar104 = vrcp14ps_avx512vl(auVar110);
      auVar105 = vfnmadd213ps_avx512vl(auVar104,auVar110,auVar119);
      auVar100 = vfmadd132ps_fma(auVar105,auVar104,auVar104);
      auVar174 = ZEXT1664(auVar100);
      auVar87._4_4_ = fVar55 * fVar3 * auVar110._4_4_;
      auVar87._0_4_ = fVar53 * fVar1 * auVar110._0_4_;
      auVar87._8_4_ = fVar58 * fVar56 * auVar110._8_4_;
      auVar87._12_4_ = fVar61 * fVar59 * auVar110._12_4_;
      auVar87._16_4_ = fVar64 * fVar62 * auVar110._16_4_;
      auVar87._20_4_ = fVar67 * fVar65 * auVar110._20_4_;
      auVar87._24_4_ = fVar70 * fVar68 * auVar110._24_4_;
      auVar87._28_4_ = auVar131._28_4_;
      _local_80 = vmulps_avx512vl(auVar106,auVar87);
      auVar105 = vmulps_avx512vl(auVar107,auVar87);
      auVar180 = ZEXT3264(auVar105);
      auVar113 = vmulps_avx512vl(auVar106,auVar144);
      auVar181 = ZEXT3264(auVar113);
      auVar131 = vmulps_avx512vl(auVar107,auVar144);
      auVar182 = ZEXT3264(auVar131);
      uVar71 = vcmpps_avx512vl(auVar129,auVar125,0);
      uVar72 = vcmpps_avx512vl(auVar129,auVar126,0);
      bVar76 = ((byte)uVar71 | (byte)uVar72) & bVar89;
      uVar95 = vcmpps_avx512vl(auVar129,auVar123,0);
      uVar95 = uVar96 & uVar97 & uVar95;
      auVar110 = vmulps_avx512vl(auVar101,auVar129);
      auVar146._0_4_ = auVar110._0_4_ + (float)local_560._0_4_;
      auVar146._4_4_ = auVar110._4_4_ + (float)local_560._4_4_;
      auVar146._8_4_ = auVar110._8_4_ + fStack_558;
      auVar146._12_4_ = auVar110._12_4_ + fStack_554;
      auVar146._16_4_ = auVar110._16_4_ + fStack_550;
      auVar146._20_4_ = auVar110._20_4_ + fStack_54c;
      auVar146._24_4_ = auVar110._24_4_ + fStack_548;
      auVar146._28_4_ = auVar110._28_4_ + local_560._28_4_;
      auVar110 = vmulps_avx512vl(auVar115,auVar146);
      auVar147._0_4_ = local_80._0_4_ + auVar110._0_4_;
      auVar147._4_4_ = local_80._4_4_ + auVar110._4_4_;
      auVar147._8_4_ = local_80._8_4_ + auVar110._8_4_;
      auVar147._12_4_ = local_80._12_4_ + auVar110._12_4_;
      auVar147._16_4_ = local_80._16_4_ + auVar110._16_4_;
      auVar147._20_4_ = local_80._20_4_ + auVar110._20_4_;
      auVar147._24_4_ = local_80._24_4_ + auVar110._24_4_;
      auVar147._28_4_ = local_80._28_4_ + auVar110._28_4_;
      auVar113 = vmulps_avx512vl(auVar113,auVar130);
      auVar110 = vxorps_avx512vl(auVar106,auVar152);
      auVar191 = ZEXT3264(auVar110);
      auVar106 = vblendmps_avx512vl(auVar106,auVar110);
      bVar88 = (byte)uVar95;
      bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar95 >> 2) & 1);
      bVar20 = (bool)((byte)(uVar95 >> 3) & 1);
      bVar23 = (bool)((byte)(uVar95 >> 4) & 1);
      bVar31 = (bool)((byte)(uVar95 >> 5) & 1);
      bVar47 = (bool)((byte)(uVar95 >> 6) & 1);
      bVar49 = SUB81(uVar95 >> 7,0);
      auVar113 = vsubps_avx512vl(auVar147,auVar113);
      bVar15 = (bool)(bVar76 >> 1 & 1);
      bVar18 = (bool)(bVar76 >> 2 & 1);
      bVar21 = (bool)(bVar76 >> 3 & 1);
      bVar24 = (bool)(bVar76 >> 4 & 1);
      bVar38 = (bool)(bVar76 >> 5 & 1);
      bVar48 = (bool)(bVar76 >> 6 & 1);
      auVar110 = vmulps_avx512vl(auVar102,auVar129);
      auVar148._0_4_ = auVar110._0_4_ + (float)local_520._0_4_;
      auVar148._4_4_ = auVar110._4_4_ + (float)local_520._4_4_;
      auVar148._8_4_ = auVar110._8_4_ + fStack_518;
      auVar148._12_4_ = auVar110._12_4_ + fStack_514;
      auVar148._16_4_ = auVar110._16_4_ + fStack_510;
      auVar148._20_4_ = auVar110._20_4_ + fStack_50c;
      auVar148._24_4_ = auVar110._24_4_ + fStack_508;
      auVar148._28_4_ = auVar110._28_4_ + fStack_504;
      auVar110 = vmulps_avx512vl(auVar115,auVar148);
      auVar105 = vaddps_avx512vl(auVar105,auVar110);
      iVar133 = (uint)!(bool)(bVar88 & 1) * auVar119._0_4_;
      iVar99 = (uint)!(bool)((byte)(uVar95 >> 1) & 1) * auVar119._4_4_;
      iVar134 = (uint)!(bool)((byte)(uVar95 >> 2) & 1) * auVar119._8_4_;
      iVar135 = (uint)!(bool)((byte)(uVar95 >> 3) & 1) * auVar119._12_4_;
      iVar136 = (uint)!(bool)((byte)(uVar95 >> 4) & 1) * auVar119._16_4_;
      iVar137 = (uint)!(bool)((byte)(uVar95 >> 5) & 1) * auVar119._20_4_;
      iVar138 = (uint)!(bool)((byte)(uVar95 >> 6) & 1) * auVar119._24_4_;
      iVar139 = (uint)!SUB81(uVar95 >> 7,0) * auVar119._28_4_;
      auVar110 = vmulps_avx512vl(auVar130,ZEXT1632(auVar100));
      bVar16 = (bool)(bVar76 >> 1 & 1);
      bVar19 = (bool)(bVar76 >> 2 & 1);
      bVar22 = (bool)(bVar76 >> 3 & 1);
      bVar30 = (bool)(bVar76 >> 4 & 1);
      bVar39 = (bool)(bVar76 >> 5 & 1);
      bVar40 = (bool)(bVar76 >> 6 & 1);
      local_500[0] = (uint)(bVar76 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar76 & 1) * iVar133;
      local_500[1] = (uint)bVar16 * auVar110._4_4_ | (uint)!bVar16 * iVar99;
      local_500[2] = (uint)bVar19 * auVar110._8_4_ | (uint)!bVar19 * iVar134;
      local_500[3] = (uint)bVar22 * auVar110._12_4_ | (uint)!bVar22 * iVar135;
      uStack_4f0 = (uint)bVar30 * auVar110._16_4_ | (uint)!bVar30 * iVar136;
      uStack_4ec = (uint)bVar39 * auVar110._20_4_ | (uint)!bVar39 * iVar137;
      uStack_4e8 = (uint)bVar40 * auVar110._24_4_ | (uint)!bVar40 * iVar138;
      uStack_4e4 = (uint)(bVar76 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar76 >> 7) * iVar139;
      auVar131 = vmulps_avx512vl(auVar131,auVar130);
      local_4e0 = ZEXT432(0) << 0x20;
      auVar110 = vxorps_avx512vl(auVar107,auVar152);
      auVar162 = ZEXT3264(auVar110);
      local_4c0._0_4_ = auVar140._0_4_ + auVar129._0_4_;
      local_4c0._4_4_ = auVar140._4_4_ + auVar129._4_4_;
      local_4c0._8_4_ = auVar140._8_4_ + auVar129._8_4_;
      local_4c0._12_4_ = auVar140._12_4_ + auVar129._12_4_;
      local_4c0._16_4_ = auVar140._16_4_ + auVar129._16_4_;
      local_4c0._20_4_ = auVar140._20_4_ + auVar129._20_4_;
      local_4c0._24_4_ = auVar140._24_4_ + auVar129._24_4_;
      local_4c0._28_4_ = auVar129._28_4_ + 0.0;
      auVar150 = ZEXT3264(local_4c0);
      local_4a0[0] = (uint)(bVar76 & 1) * auVar113._0_4_ |
                     (uint)!(bool)(bVar76 & 1) *
                     ((uint)(bVar88 & 1) * auVar106._0_4_ |
                     (uint)!(bool)(bVar88 & 1) * auVar104._0_4_);
      local_4a0[1] = (uint)bVar15 * auVar113._4_4_ |
                     (uint)!bVar15 *
                     ((uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar104._4_4_);
      local_4a0[2] = (uint)bVar18 * auVar113._8_4_ |
                     (uint)!bVar18 *
                     ((uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar104._8_4_);
      local_4a0[3] = (uint)bVar21 * auVar113._12_4_ |
                     (uint)!bVar21 *
                     ((uint)bVar20 * auVar106._12_4_ | (uint)!bVar20 * auVar104._12_4_);
      uStack_490 = (uint)bVar24 * auVar113._16_4_ |
                   (uint)!bVar24 *
                   ((uint)bVar23 * auVar106._16_4_ | (uint)!bVar23 * auVar104._16_4_);
      uStack_48c = (uint)bVar38 * auVar113._20_4_ |
                   (uint)!bVar38 *
                   ((uint)bVar31 * auVar106._20_4_ | (uint)!bVar31 * auVar104._20_4_);
      uStack_488 = (uint)bVar48 * auVar113._24_4_ |
                   (uint)!bVar48 *
                   ((uint)bVar47 * auVar106._24_4_ | (uint)!bVar47 * auVar104._24_4_);
      uStack_484 = (uint)(bVar76 >> 7) * auVar113._28_4_ |
                   (uint)!(bool)(bVar76 >> 7) *
                   ((uint)bVar49 * auVar106._28_4_ | (uint)!bVar49 * auVar104._28_4_);
      auVar104 = vblendmps_avx512vl(auVar107,auVar110);
      bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar95 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar95 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar95 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar95 >> 5) & 1);
      bVar20 = (bool)((byte)(uVar95 >> 6) & 1);
      auVar105 = vsubps_avx512vl(auVar105,auVar131);
      local_480[0] = (uint)(bVar76 & 1) * auVar105._0_4_ |
                     (uint)!(bool)(bVar76 & 1) *
                     ((uint)(bVar88 & 1) * auVar104._0_4_ |
                     (uint)!(bool)(bVar88 & 1) * (int)auVar140._0_4_);
      bVar15 = (bool)(bVar76 >> 1 & 1);
      local_480[1] = (uint)bVar15 * auVar105._4_4_ |
                     (uint)!bVar15 *
                     ((uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * (int)auVar140._4_4_);
      bVar14 = (bool)(bVar76 >> 2 & 1);
      local_480[2] = (uint)bVar14 * auVar105._8_4_ |
                     (uint)!bVar14 *
                     ((uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * (int)auVar140._8_4_);
      bVar14 = (bool)(bVar76 >> 3 & 1);
      local_480[3] = (uint)bVar14 * auVar105._12_4_ |
                     (uint)!bVar14 *
                     ((uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * (int)auVar140._12_4_);
      bVar14 = (bool)(bVar76 >> 4 & 1);
      uStack_470 = (uint)bVar14 * auVar105._16_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar18 * auVar104._16_4_ | (uint)!bVar18 * (int)auVar140._16_4_);
      bVar14 = (bool)(bVar76 >> 5 & 1);
      uStack_46c = (uint)bVar14 * auVar105._20_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar19 * auVar104._20_4_ | (uint)!bVar19 * (int)auVar140._20_4_);
      bVar14 = (bool)(bVar76 >> 6 & 1);
      uStack_468 = (uint)bVar14 * auVar105._24_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar20 * auVar104._24_4_ | (uint)!bVar20 * (int)auVar140._24_4_);
      uStack_464 = (uint)(bVar76 >> 7) * auVar105._28_4_ |
                   (uint)!(bool)(bVar76 >> 7) * (uint)(byte)(uVar95 >> 7) * auVar104._28_4_;
      auVar104 = vmulps_avx512vl(auVar108,auVar87);
      auVar149 = ZEXT3264(auVar104);
      auVar105 = vmulps_avx512vl(auVar108,auVar144);
      auVar160 = ZEXT3264(auVar105);
      auVar106 = vmulps_avx512vl(auVar103,auVar129);
      auVar106 = vaddps_avx512vl(auVar109,auVar106);
      auVar106 = vmulps_avx512vl(auVar115,auVar106);
      auVar103._0_4_ = auVar104._0_4_ + auVar106._0_4_;
      auVar103._4_4_ = auVar104._4_4_ + auVar106._4_4_;
      auVar103._8_4_ = auVar104._8_4_ + auVar106._8_4_;
      auVar103._12_4_ = auVar104._12_4_ + auVar106._12_4_;
      auVar103._16_4_ = auVar104._16_4_ + auVar106._16_4_;
      auVar103._20_4_ = auVar104._20_4_ + auVar106._20_4_;
      auVar103._24_4_ = auVar104._24_4_ + auVar106._24_4_;
      auVar103._28_4_ = auVar104._28_4_ + auVar106._28_4_;
      auVar101._4_4_ = auVar105._4_4_ * auVar130._4_4_;
      auVar101._0_4_ = auVar105._0_4_ * auVar130._0_4_;
      auVar101._8_4_ = auVar105._8_4_ * auVar130._8_4_;
      auVar101._12_4_ = auVar105._12_4_ * auVar130._12_4_;
      auVar101._16_4_ = auVar105._16_4_ * auVar130._16_4_;
      auVar101._20_4_ = auVar105._20_4_ * auVar130._20_4_;
      auVar101._24_4_ = auVar105._24_4_ * auVar130._24_4_;
      auVar101._28_4_ = auVar144._28_4_;
      auVar104 = vxorps_avx512vl(auVar108,auVar152);
      auVar154 = ZEXT3264(auVar104);
      auVar104 = vblendmps_avx512vl(auVar108,auVar104);
      bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar95 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar95 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar95 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar95 >> 5) & 1);
      bVar20 = (bool)((byte)(uVar95 >> 6) & 1);
      bVar21 = SUB81(uVar95 >> 7,0);
      auVar105 = vsubps_avx512vl(auVar103,auVar101);
      local_460[0] = (uint)(bVar76 & 1) * auVar105._0_4_ |
                     (uint)!(bool)(bVar76 & 1) *
                     ((uint)(bVar88 & 1) * auVar104._0_4_ | !(bool)(bVar88 & 1) * local_480[0]);
      bVar15 = (bool)(bVar76 >> 1 & 1);
      local_460[1] = (uint)bVar15 * auVar105._4_4_ |
                     (uint)!bVar15 * ((uint)bVar14 * auVar104._4_4_ | !bVar14 * local_480[1]);
      bVar14 = (bool)(bVar76 >> 2 & 1);
      local_460[2] = (uint)bVar14 * auVar105._8_4_ |
                     (uint)!bVar14 * ((uint)bVar16 * auVar104._8_4_ | !bVar16 * local_480[2]);
      bVar14 = (bool)(bVar76 >> 3 & 1);
      local_460[3] = (uint)bVar14 * auVar105._12_4_ |
                     (uint)!bVar14 * ((uint)bVar17 * auVar104._12_4_ | !bVar17 * local_480[3]);
      bVar14 = (bool)(bVar76 >> 4 & 1);
      uStack_450 = (uint)bVar14 * auVar105._16_4_ |
                   (uint)!bVar14 * ((uint)bVar18 * auVar104._16_4_ | !bVar18 * uStack_470);
      bVar14 = (bool)(bVar76 >> 5 & 1);
      uStack_44c = (uint)bVar14 * auVar105._20_4_ |
                   (uint)!bVar14 * ((uint)bVar19 * auVar104._20_4_ | !bVar19 * uStack_46c);
      bVar14 = (bool)(bVar76 >> 6 & 1);
      uStack_448 = (uint)bVar14 * auVar105._24_4_ |
                   (uint)!bVar14 * ((uint)bVar20 * auVar104._24_4_ | !bVar20 * uStack_468);
      uStack_444 = (uint)(bVar76 >> 7) * auVar105._28_4_ |
                   (uint)!(bool)(bVar76 >> 7) *
                   ((uint)bVar21 * auVar104._28_4_ | !bVar21 * uStack_464);
      auVar104 = vblendmps_avx512vl(auVar116,local_4c0);
      auVar102._0_4_ = (uint)(bVar77 & 1) * auVar104._0_4_ | !(bool)(bVar77 & 1) * local_460[0];
      bVar14 = (bool)(bVar77 >> 1 & 1);
      auVar102._4_4_ = (uint)bVar14 * auVar104._4_4_ | !bVar14 * local_460[1];
      bVar14 = (bool)(bVar77 >> 2 & 1);
      auVar102._8_4_ = (uint)bVar14 * auVar104._8_4_ | !bVar14 * local_460[2];
      bVar14 = (bool)(bVar77 >> 3 & 1);
      auVar102._12_4_ = (uint)bVar14 * auVar104._12_4_ | !bVar14 * local_460[3];
      bVar14 = (bool)(bVar77 >> 4 & 1);
      auVar102._16_4_ = (uint)bVar14 * auVar104._16_4_ | !bVar14 * uStack_450;
      bVar14 = (bool)(bVar77 >> 5 & 1);
      auVar102._20_4_ = (uint)bVar14 * auVar104._20_4_ | !bVar14 * uStack_44c;
      bVar14 = (bool)(bVar77 >> 6 & 1);
      auVar102._24_4_ = (uint)bVar14 * auVar104._24_4_ | !bVar14 * uStack_448;
      auVar102._28_4_ = (uint)(bVar77 >> 7) * auVar104._28_4_ | !(bool)(bVar77 >> 7) * uStack_444;
      auVar104 = vshufps_avx(auVar102,auVar102,0xb1);
      auVar104 = vminps_avx(auVar102,auVar104);
      auVar105 = vshufpd_avx(auVar104,auVar104,5);
      auVar104 = vminps_avx(auVar104,auVar105);
      auVar105 = vpermpd_avx2(auVar104,0x4e);
      auVar104 = vminps_avx(auVar104,auVar105);
      uVar71 = vcmpps_avx512vl(auVar102,auVar104,0);
      uVar91 = uVar94;
      if (((byte)uVar71 & bVar77) != 0) {
        uVar91 = (uint)((byte)uVar71 & bVar77);
      }
      uVar90 = 0;
      for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
        uVar90 = uVar90 + 1;
      }
      auVar100 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar176 = ZEXT1664(auVar100);
LAB_01ce97a2:
      local_590.valid = (int *)local_5b0;
      uVar92 = uVar90 & 0xff;
      uVar91 = *(uint *)(local_a0 + (ulong)uVar92 * 4);
      pGVar11 = (pSVar10->geometries).items[uVar91].ptr;
      auVar104 = auVar102;
      local_590.ray = (RTCRayN *)ray;
      if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
        uVar94 = (uint)(byte)(~(byte)(1 << (uVar90 & 0x1f)) & (byte)uVar94);
LAB_01ce97f1:
        bVar14 = true;
      }
      else {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
          local_100 = auVar150._0_32_;
          local_e0 = auVar149._0_32_;
          local_c0 = auVar154._0_32_;
          uVar97 = (ulong)(uVar92 * 4);
          local_400 = *(undefined4 *)((long)local_500 + uVar97);
          local_3f0 = *(undefined4 *)(local_4e0 + uVar97);
          local_3d0 = vpbroadcastd_avx512vl();
          local_3e0._4_4_ = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar97);
          uVar4 = *(undefined4 *)((long)local_4a0 + uVar97);
          auVar100._4_4_ = uVar4;
          auVar100._0_4_ = uVar4;
          auVar100._8_4_ = uVar4;
          auVar100._12_4_ = uVar4;
          uVar5 = *(undefined4 *)((long)local_480 + uVar97);
          local_420._4_4_ = uVar5;
          local_420._0_4_ = uVar5;
          local_420._8_4_ = uVar5;
          local_420._12_4_ = uVar5;
          local_410._4_4_ = *(undefined4 *)((long)local_460 + uVar97);
          local_430[0] = (RTCHitN)(char)uVar4;
          local_430[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_430[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_430[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_430[4] = (RTCHitN)(char)uVar4;
          local_430[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_430[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_430[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_430[8] = (RTCHitN)(char)uVar4;
          local_430[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_430[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_430[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_430[0xc] = (RTCHitN)(char)uVar4;
          local_430[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_430[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_430[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          vpcmpeqd_avx2(ZEXT1632(auVar100),ZEXT1632(auVar100));
          local_410._0_4_ = local_410._4_4_;
          local_410._8_4_ = local_410._4_4_;
          local_410._12_4_ = local_410._4_4_;
          uStack_3fc = local_400;
          uStack_3f8 = local_400;
          uStack_3f4 = local_400;
          uStack_3ec = local_3f0;
          uStack_3e8 = local_3f0;
          uStack_3e4 = local_3f0;
          local_3e0._0_4_ = local_3e0._4_4_;
          local_3e0._8_4_ = local_3e0._4_4_;
          local_3e0._12_4_ = local_3e0._4_4_;
          uStack_3bc = context->user->instID[0];
          local_3c0 = uStack_3bc;
          uStack_3b8 = uStack_3bc;
          uStack_3b4 = uStack_3bc;
          uStack_3b0 = context->user->instPrimID[0];
          uStack_3ac = uStack_3b0;
          uStack_3a8 = uStack_3b0;
          uStack_3a4 = uStack_3b0;
          local_594 = *(uint *)(ray + k * 4 + 0x80);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_4c0 + uVar97);
          local_5b0 = auVar176._0_16_;
          local_590.geometryUserPtr = pGVar11->userPtr;
          local_590.context = context->user;
          local_590.hit = local_430;
          local_590.N = 4;
          local_540 = auVar166._0_32_;
          local_120 = auVar185._0_32_;
          local_140 = auVar186._0_32_;
          local_160 = auVar187._0_32_;
          local_180 = auVar188._0_32_;
          local_1a0 = auVar189._0_32_;
          local_1c0 = auVar190._0_32_;
          local_1e0 = auVar193._0_32_;
          local_200 = auVar194._0_32_;
          local_220 = iVar133;
          iStack_21c = iVar99;
          iStack_218 = iVar134;
          iStack_214 = iVar135;
          iStack_210 = iVar136;
          iStack_20c = iVar137;
          iStack_208 = iVar138;
          iStack_204 = iVar139;
          local_240 = auVar192._0_32_;
          local_260 = auVar183._0_32_;
          local_280 = auVar177._0_32_;
          local_2a0 = auVar178._0_32_;
          local_2c0 = auVar174._0_32_;
          local_2e0 = auVar179._0_32_;
          local_300 = auVar180._0_32_;
          local_320 = auVar181._0_32_;
          local_340 = auVar182._0_32_;
          local_360 = auVar191._0_32_;
          local_380 = auVar162._0_32_;
          local_3a0 = auVar160._0_32_;
          local_440 = local_5b0;
          uVar97 = uVar98;
          if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_5a0 = k;
            (*pGVar11->intersectionFilterN)(&local_590);
            auVar176 = ZEXT1664(local_440);
            auVar160 = ZEXT3264(local_3a0);
            auVar162 = ZEXT3264(local_380);
            auVar191 = ZEXT3264(local_360);
            uVar97 = uVar98 & 0xffff;
            auVar182 = ZEXT3264(local_340);
            auVar181 = ZEXT3264(local_320);
            auVar180 = ZEXT3264(local_300);
            auVar179 = ZEXT3264(local_2e0);
            auVar174 = ZEXT3264(local_2c0);
            auVar178 = ZEXT3264(local_2a0);
            auVar177 = ZEXT3264(local_280);
            auVar183 = ZEXT3264(local_260);
            auVar192 = ZEXT3264(local_240);
            auVar194 = ZEXT3264(local_200);
            auVar193 = ZEXT3264(local_1e0);
            auVar190 = ZEXT3264(local_1c0);
            auVar189 = ZEXT3264(local_1a0);
            auVar188 = ZEXT3264(local_180);
            auVar187 = ZEXT3264(local_160);
            auVar186 = ZEXT3264(local_140);
            auVar185 = ZEXT3264(local_120);
            auVar166 = ZEXT3264(local_540);
            auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar184 = ZEXT3264(auVar104);
            k = local_5a0;
          }
          uVar96 = vptestmd_avx512vl(local_5b0,local_5b0);
          auVar154 = ZEXT3264(local_c0);
          auVar149 = ZEXT3264(local_e0);
          auVar150 = ZEXT3264(local_100);
          if ((uVar96 & 0xf) == 0) {
LAB_01ce9d68:
            auVar104 = ZEXT432(local_594);
            *(uint *)(ray + k * 4 + 0x80) = local_594;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var13)(&local_590);
              auVar176 = ZEXT1664(local_440);
              auVar150 = ZEXT3264(local_100);
              auVar149 = ZEXT3264(local_e0);
              auVar154 = ZEXT3264(local_c0);
              auVar160 = ZEXT3264(local_3a0);
              auVar162 = ZEXT3264(local_380);
              auVar191 = ZEXT3264(local_360);
              uVar97 = uVar98 & 0xffff;
              auVar182 = ZEXT3264(local_340);
              auVar181 = ZEXT3264(local_320);
              auVar180 = ZEXT3264(local_300);
              auVar179 = ZEXT3264(local_2e0);
              auVar174 = ZEXT3264(local_2c0);
              auVar178 = ZEXT3264(local_2a0);
              auVar177 = ZEXT3264(local_280);
              auVar183 = ZEXT3264(local_260);
              auVar192 = ZEXT3264(local_240);
              auVar194 = ZEXT3264(local_200);
              auVar193 = ZEXT3264(local_1e0);
              auVar190 = ZEXT3264(local_1c0);
              auVar189 = ZEXT3264(local_1a0);
              auVar188 = ZEXT3264(local_180);
              auVar187 = ZEXT3264(local_160);
              auVar186 = ZEXT3264(local_140);
              auVar185 = ZEXT3264(local_120);
              auVar166 = ZEXT3264(local_540);
              auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar184 = ZEXT3264(auVar104);
            }
            uVar96 = vptestmd_avx512vl(local_5b0,local_5b0);
            uVar96 = uVar96 & 0xf;
            bVar88 = (byte)uVar96;
            if (bVar88 == 0) goto LAB_01ce9d68;
            iVar99 = *(int *)(local_590.hit + 4);
            iVar133 = *(int *)(local_590.hit + 8);
            iVar134 = *(int *)(local_590.hit + 0xc);
            bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
            bVar16 = SUB81(uVar96 >> 3,0);
            *(uint *)(local_590.ray + 0xc0) =
                 (uint)(bVar88 & 1) * *(int *)local_590.hit |
                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0xc0);
            *(uint *)(local_590.ray + 0xc4) =
                 (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_590.ray + 0xc4);
            *(uint *)(local_590.ray + 200) =
                 (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_590.ray + 200);
            *(uint *)(local_590.ray + 0xcc) =
                 (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_590.ray + 0xcc);
            iVar99 = *(int *)(local_590.hit + 0x14);
            iVar133 = *(int *)(local_590.hit + 0x18);
            iVar134 = *(int *)(local_590.hit + 0x1c);
            bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
            bVar16 = SUB81(uVar96 >> 3,0);
            *(uint *)(local_590.ray + 0xd0) =
                 (uint)(bVar88 & 1) * *(int *)(local_590.hit + 0x10) |
                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0xd0);
            *(uint *)(local_590.ray + 0xd4) =
                 (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_590.ray + 0xd4);
            *(uint *)(local_590.ray + 0xd8) =
                 (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_590.ray + 0xd8);
            *(uint *)(local_590.ray + 0xdc) =
                 (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_590.ray + 0xdc);
            iVar99 = *(int *)(local_590.hit + 0x24);
            iVar133 = *(int *)(local_590.hit + 0x28);
            iVar134 = *(int *)(local_590.hit + 0x2c);
            bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
            bVar16 = SUB81(uVar96 >> 3,0);
            *(uint *)(local_590.ray + 0xe0) =
                 (uint)(bVar88 & 1) * *(int *)(local_590.hit + 0x20) |
                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0xe0);
            *(uint *)(local_590.ray + 0xe4) =
                 (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_590.ray + 0xe4);
            *(uint *)(local_590.ray + 0xe8) =
                 (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_590.ray + 0xe8);
            *(uint *)(local_590.ray + 0xec) =
                 (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_590.ray + 0xec);
            iVar99 = *(int *)(local_590.hit + 0x34);
            iVar133 = *(int *)(local_590.hit + 0x38);
            iVar134 = *(int *)(local_590.hit + 0x3c);
            bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
            bVar16 = SUB81(uVar96 >> 3,0);
            *(uint *)(local_590.ray + 0xf0) =
                 (uint)(bVar88 & 1) * *(int *)(local_590.hit + 0x30) |
                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0xf0);
            *(uint *)(local_590.ray + 0xf4) =
                 (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_590.ray + 0xf4);
            *(uint *)(local_590.ray + 0xf8) =
                 (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_590.ray + 0xf8);
            *(uint *)(local_590.ray + 0xfc) =
                 (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_590.ray + 0xfc);
            iVar99 = *(int *)(local_590.hit + 0x44);
            iVar133 = *(int *)(local_590.hit + 0x48);
            iVar134 = *(int *)(local_590.hit + 0x4c);
            bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
            bVar16 = SUB81(uVar96 >> 3,0);
            *(uint *)(local_590.ray + 0x100) =
                 (uint)(bVar88 & 1) * *(int *)(local_590.hit + 0x40) |
                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0x100);
            *(uint *)(local_590.ray + 0x104) =
                 (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_590.ray + 0x104);
            *(uint *)(local_590.ray + 0x108) =
                 (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_590.ray + 0x108);
            *(uint *)(local_590.ray + 0x10c) =
                 (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_590.ray + 0x10c);
            auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50));
            *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar100;
            auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60));
            *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar100;
            auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70));
            *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar100;
            auVar104 = ZEXT1632(*(undefined1 (*) [16])(local_590.hit + 0x80));
            auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80));
            *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar100;
          }
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar80._4_4_ = uVar4;
          auVar80._0_4_ = uVar4;
          auVar80._8_4_ = uVar4;
          auVar80._12_4_ = uVar4;
          auVar80._16_4_ = uVar4;
          auVar80._20_4_ = uVar4;
          auVar80._24_4_ = uVar4;
          auVar80._28_4_ = uVar4;
          uVar71 = vcmpps_avx512vl(auVar150._0_32_,auVar80,2);
          uVar94 = (uint)(byte)(~(byte)(1 << (uVar90 & 0x1f)) & (byte)uVar94) & (uint)uVar71;
          uVar98 = uVar97;
          iVar133 = local_220;
          iVar99 = iStack_21c;
          iVar134 = iStack_218;
          iVar135 = iStack_214;
          iVar136 = iStack_210;
          iVar137 = iStack_20c;
          iVar138 = iStack_208;
          iVar139 = iStack_204;
          goto LAB_01ce97f1;
        }
        bVar14 = false;
      }
      if (bVar14) {
        bVar88 = (byte)uVar94;
        if (bVar88 == 0) goto LAB_01ce9e3f;
        auVar105 = vblendmps_avx512vl(auVar184._0_32_,auVar150._0_32_);
        auVar102._0_4_ =
             (uint)(bVar88 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar104._0_4_;
        bVar14 = (bool)((byte)(uVar94 >> 1) & 1);
        auVar102._4_4_ = (uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar104._4_4_;
        bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
        auVar102._8_4_ = (uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar104._8_4_;
        bVar14 = (bool)((byte)(uVar94 >> 3) & 1);
        auVar102._12_4_ = (uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar104._12_4_;
        bVar14 = (bool)((byte)(uVar94 >> 4) & 1);
        auVar102._16_4_ = (uint)bVar14 * auVar105._16_4_ | (uint)!bVar14 * auVar104._16_4_;
        bVar14 = (bool)((byte)(uVar94 >> 5) & 1);
        auVar102._20_4_ = (uint)bVar14 * auVar105._20_4_ | (uint)!bVar14 * auVar104._20_4_;
        bVar14 = (bool)((byte)(uVar94 >> 6) & 1);
        auVar102._24_4_ = (uint)bVar14 * auVar105._24_4_ | (uint)!bVar14 * auVar104._24_4_;
        auVar102._28_4_ =
             (uVar94 >> 7) * auVar105._28_4_ | (uint)!SUB41(uVar94 >> 7,0) * auVar104._28_4_;
        auVar104 = vshufps_avx(auVar102,auVar102,0xb1);
        auVar104 = vminps_avx(auVar102,auVar104);
        auVar105 = vshufpd_avx(auVar104,auVar104,5);
        auVar104 = vminps_avx(auVar104,auVar105);
        auVar105 = vpermpd_avx2(auVar104,0x4e);
        auVar104 = vminps_avx(auVar104,auVar105);
        uVar71 = vcmpps_avx512vl(auVar102,auVar104,0);
        bVar88 = (byte)uVar71 & bVar88;
        uVar91 = uVar94;
        if (bVar88 != 0) {
          uVar91 = (uint)bVar88;
        }
        uVar90 = 0;
        for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
          uVar90 = uVar90 + 1;
        }
        goto LAB_01ce97a2;
      }
      uVar97 = (ulong)(uVar92 << 2);
      uVar4 = *(undefined4 *)((long)local_500 + uVar97);
      uVar5 = *(undefined4 *)(local_4e0 + uVar97);
      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_4c0 + uVar97);
      *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_4a0 + uVar97);
      *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_480 + uVar97);
      *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_460 + uVar97);
      *(undefined4 *)(ray + k * 4 + 0xf0) = uVar4;
      *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
      *(undefined4 *)(ray + k * 4 + 0x110) =
           *(undefined4 *)((long)&(line->primIDs).field_0 + uVar97);
      *(uint *)(ray + k * 4 + 0x120) = uVar91;
      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
LAB_01ce9e3f:
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar78._4_4_ = uVar4;
      auVar78._0_4_ = uVar4;
      auVar78._8_4_ = uVar4;
      auVar78._12_4_ = uVar4;
      auVar78._16_4_ = uVar4;
      auVar78._20_4_ = uVar4;
      auVar78._24_4_ = uVar4;
      auVar78._28_4_ = uVar4;
      local_4c0 = auVar166._0_32_;
      uVar71 = vcmpps_avx512vl(local_4c0,auVar78,2);
      bVar89 = (byte)uVar98 & (byte)uVar71 & bVar93 & bVar89;
      uVar94 = (uint)bVar89;
      if (bVar89 != 0) {
        auVar106 = auVar179._0_32_;
        uVar71 = vcmpps_avx512vl(auVar106,auVar177._0_32_,0);
        uVar72 = vcmpps_avx512vl(auVar106,auVar178._0_32_,0);
        bVar77 = (byte)uVar71 | (byte)uVar72;
        uVar97 = vcmpps_avx512vl(auVar106,auVar183._0_32_,0);
        auVar104 = vmulps_avx512vl(auVar185._0_32_,auVar106);
        auVar105 = vmulps_avx512vl(auVar186._0_32_,auVar106);
        auVar106 = vmulps_avx512vl(auVar187._0_32_,auVar106);
        auVar141._0_4_ = auVar104._0_4_ + (float)local_560._0_4_;
        auVar141._4_4_ = auVar104._4_4_ + (float)local_560._4_4_;
        auVar141._8_4_ = auVar104._8_4_ + fStack_558;
        auVar141._12_4_ = auVar104._12_4_ + fStack_554;
        auVar141._16_4_ = auVar104._16_4_ + fStack_550;
        auVar141._20_4_ = auVar104._20_4_ + fStack_54c;
        auVar141._24_4_ = auVar104._24_4_ + fStack_548;
        auVar141._28_4_ = auVar104._28_4_ + fStack_544;
        auVar143._0_4_ = auVar105._0_4_ + (float)local_520._0_4_;
        auVar143._4_4_ = auVar105._4_4_ + (float)local_520._4_4_;
        auVar143._8_4_ = auVar105._8_4_ + fStack_518;
        auVar143._12_4_ = auVar105._12_4_ + fStack_514;
        auVar143._16_4_ = auVar105._16_4_ + fStack_510;
        auVar143._20_4_ = auVar105._20_4_ + fStack_50c;
        auVar143._24_4_ = auVar105._24_4_ + fStack_508;
        auVar143._28_4_ = auVar105._28_4_ + fStack_504;
        auVar104 = vaddps_avx512vl(auVar193._0_32_,auVar106);
        auVar113 = auVar194._0_32_;
        auVar105 = vmulps_avx512vl(auVar113,auVar141);
        auVar106 = vmulps_avx512vl(auVar113,auVar143);
        auVar104 = vmulps_avx512vl(auVar113,auVar104);
        auVar142._0_4_ = auVar105._0_4_ + (float)local_80._0_4_;
        auVar142._4_4_ = auVar105._4_4_ + (float)local_80._4_4_;
        auVar142._8_4_ = auVar105._8_4_ + fStack_78;
        auVar142._12_4_ = auVar105._12_4_ + fStack_74;
        auVar142._16_4_ = auVar105._16_4_ + fStack_70;
        auVar142._20_4_ = auVar105._20_4_ + fStack_6c;
        auVar142._24_4_ = auVar105._24_4_ + fStack_68;
        auVar142._28_4_ = auVar105._28_4_ + fStack_64;
        auVar105 = vaddps_avx512vl(auVar180._0_32_,auVar106);
        auVar145._0_4_ = auVar149._0_4_ + auVar104._0_4_;
        auVar145._4_4_ = auVar149._4_4_ + auVar104._4_4_;
        auVar145._8_4_ = auVar149._8_4_ + auVar104._8_4_;
        auVar145._12_4_ = auVar149._12_4_ + auVar104._12_4_;
        auVar145._16_4_ = auVar149._16_4_ + auVar104._16_4_;
        auVar145._20_4_ = auVar149._20_4_ + auVar104._20_4_;
        auVar145._24_4_ = auVar149._24_4_ + auVar104._24_4_;
        auVar145._28_4_ = auVar149._28_4_ + auVar104._28_4_;
        auVar109 = auVar192._0_32_;
        auVar104 = vmulps_avx512vl(auVar181._0_32_,auVar109);
        auVar106 = vmulps_avx512vl(auVar182._0_32_,auVar109);
        auVar131 = auVar160._0_32_;
        auVar113 = vmulps_avx512vl(auVar131,auVar109);
        bVar88 = (byte)uVar97;
        bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar97 >> 2) & 1);
        bVar31 = (bool)((byte)(uVar97 >> 3) & 1);
        bVar49 = (bool)((byte)(uVar97 >> 4) & 1);
        bVar32 = (bool)((byte)(uVar97 >> 5) & 1);
        bVar41 = (bool)((byte)(uVar97 >> 6) & 1);
        bVar50 = SUB81(uVar97 >> 7,0);
        bVar15 = (bool)((byte)(uVar97 >> 1) & 1);
        bVar21 = (bool)((byte)(uVar97 >> 2) & 1);
        bVar38 = (bool)((byte)(uVar97 >> 3) & 1);
        bVar25 = (bool)((byte)(uVar97 >> 4) & 1);
        bVar33 = (bool)((byte)(uVar97 >> 5) & 1);
        bVar42 = (bool)((byte)(uVar97 >> 6) & 1);
        bVar51 = SUB81(uVar97 >> 7,0);
        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
        bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
        bVar39 = (bool)((byte)(uVar97 >> 3) & 1);
        bVar26 = (bool)((byte)(uVar97 >> 4) & 1);
        bVar34 = (bool)((byte)(uVar97 >> 5) & 1);
        bVar43 = (bool)((byte)(uVar97 >> 6) & 1);
        bVar52 = SUB81(uVar97 >> 7,0);
        auVar104 = vsubps_avx512vl(auVar142,auVar104);
        bVar17 = (bool)(bVar77 >> 1 & 1);
        bVar23 = (bool)(bVar77 >> 2 & 1);
        bVar47 = (bool)(bVar77 >> 3 & 1);
        bVar27 = (bool)(bVar77 >> 4 & 1);
        bVar35 = (bool)(bVar77 >> 5 & 1);
        bVar44 = (bool)(bVar77 >> 6 & 1);
        auVar105 = vsubps_avx512vl(auVar105,auVar106);
        bVar18 = (bool)(bVar77 >> 1 & 1);
        bVar24 = (bool)(bVar77 >> 2 & 1);
        bVar48 = (bool)(bVar77 >> 3 & 1);
        bVar28 = (bool)(bVar77 >> 4 & 1);
        bVar36 = (bool)(bVar77 >> 5 & 1);
        bVar45 = (bool)(bVar77 >> 6 & 1);
        auVar106 = vmulps_avx512vl(auVar109,auVar174._0_32_);
        bVar19 = (bool)(bVar77 >> 1 & 1);
        bVar30 = (bool)(bVar77 >> 2 & 1);
        bVar40 = (bool)(bVar77 >> 3 & 1);
        bVar29 = (bool)(bVar77 >> 4 & 1);
        bVar37 = (bool)(bVar77 >> 5 & 1);
        bVar46 = (bool)(bVar77 >> 6 & 1);
        local_500[0] = (uint)(bVar77 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar77 & 1) * iVar133;
        local_500[1] = (uint)bVar19 * auVar106._4_4_ | (uint)!bVar19 * iVar99;
        local_500[2] = (uint)bVar30 * auVar106._8_4_ | (uint)!bVar30 * iVar134;
        local_500[3] = (uint)bVar40 * auVar106._12_4_ | (uint)!bVar40 * iVar135;
        uStack_4f0 = (uint)bVar29 * auVar106._16_4_ | (uint)!bVar29 * iVar136;
        uStack_4ec = (uint)bVar37 * auVar106._20_4_ | (uint)!bVar37 * iVar137;
        uStack_4e8 = (uint)bVar46 * auVar106._24_4_ | (uint)!bVar46 * iVar138;
        uStack_4e4 = (uint)(bVar77 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar77 >> 7) * iVar139;
        local_4e0 = ZEXT432(0) << 0x20;
        local_4a0[0] = (uint)(bVar77 & 1) * auVar104._0_4_ |
                       (uint)!(bool)(bVar77 & 1) *
                       ((uint)(bVar88 & 1) * auVar191._0_4_ |
                       (uint)!(bool)(bVar88 & 1) * auVar190._0_4_);
        local_4a0[1] = (uint)bVar17 * auVar104._4_4_ |
                       (uint)!bVar17 *
                       ((uint)bVar14 * auVar191._4_4_ | (uint)!bVar14 * auVar190._4_4_);
        local_4a0[2] = (uint)bVar23 * auVar104._8_4_ |
                       (uint)!bVar23 *
                       ((uint)bVar20 * auVar191._8_4_ | (uint)!bVar20 * auVar190._8_4_);
        local_4a0[3] = (uint)bVar47 * auVar104._12_4_ |
                       (uint)!bVar47 *
                       ((uint)bVar31 * auVar191._12_4_ | (uint)!bVar31 * auVar190._12_4_);
        uStack_490 = (uint)bVar27 * auVar104._16_4_ |
                     (uint)!bVar27 *
                     ((uint)bVar49 * auVar191._16_4_ | (uint)!bVar49 * auVar190._16_4_);
        uStack_48c = (uint)bVar35 * auVar104._20_4_ |
                     (uint)!bVar35 *
                     ((uint)bVar32 * auVar191._20_4_ | (uint)!bVar32 * auVar190._20_4_);
        uStack_488 = (uint)bVar44 * auVar104._24_4_ |
                     (uint)!bVar44 *
                     ((uint)bVar41 * auVar191._24_4_ | (uint)!bVar41 * auVar190._24_4_);
        uStack_484 = (uint)(bVar77 >> 7) * auVar104._28_4_ |
                     (uint)!(bool)(bVar77 >> 7) *
                     ((uint)bVar50 * auVar191._28_4_ | (uint)!bVar50 * auVar190._28_4_);
        auVar104 = vsubps_avx512vl(auVar145,auVar113);
        bVar14 = (bool)(bVar77 >> 1 & 1);
        bVar17 = (bool)(bVar77 >> 2 & 1);
        bVar19 = (bool)(bVar77 >> 3 & 1);
        bVar20 = (bool)(bVar77 >> 4 & 1);
        bVar23 = (bool)(bVar77 >> 5 & 1);
        bVar30 = (bool)(bVar77 >> 6 & 1);
        local_480[0] = (uint)(bVar77 & 1) * auVar105._0_4_ |
                       (uint)!(bool)(bVar77 & 1) *
                       ((uint)(bVar88 & 1) * auVar162._0_4_ |
                       (uint)!(bool)(bVar88 & 1) * auVar188._0_4_);
        local_480[1] = (uint)bVar18 * auVar105._4_4_ |
                       (uint)!bVar18 *
                       ((uint)bVar15 * auVar162._4_4_ | (uint)!bVar15 * auVar188._4_4_);
        local_480[2] = (uint)bVar24 * auVar105._8_4_ |
                       (uint)!bVar24 *
                       ((uint)bVar21 * auVar162._8_4_ | (uint)!bVar21 * auVar188._8_4_);
        local_480[3] = (uint)bVar48 * auVar105._12_4_ |
                       (uint)!bVar48 *
                       ((uint)bVar38 * auVar162._12_4_ | (uint)!bVar38 * auVar188._12_4_);
        uStack_470 = (uint)bVar28 * auVar105._16_4_ |
                     (uint)!bVar28 *
                     ((uint)bVar25 * auVar162._16_4_ | (uint)!bVar25 * auVar188._16_4_);
        uStack_46c = (uint)bVar36 * auVar105._20_4_ |
                     (uint)!bVar36 *
                     ((uint)bVar33 * auVar162._20_4_ | (uint)!bVar33 * auVar188._20_4_);
        uStack_468 = (uint)bVar45 * auVar105._24_4_ |
                     (uint)!bVar45 *
                     ((uint)bVar42 * auVar162._24_4_ | (uint)!bVar42 * auVar188._24_4_);
        uStack_464 = (uint)(bVar77 >> 7) * auVar105._28_4_ |
                     (uint)!(bool)(bVar77 >> 7) *
                     ((uint)bVar51 * auVar162._28_4_ | (uint)!bVar51 * auVar188._28_4_);
        local_460[0] = (uint)(bVar77 & 1) * auVar104._0_4_ |
                       (uint)!(bool)(bVar77 & 1) *
                       ((uint)(bVar88 & 1) * auVar154._0_4_ |
                       (uint)!(bool)(bVar88 & 1) * auVar189._0_4_);
        local_460[1] = (uint)bVar14 * auVar104._4_4_ |
                       (uint)!bVar14 *
                       ((uint)bVar16 * auVar154._4_4_ | (uint)!bVar16 * auVar189._4_4_);
        local_460[2] = (uint)bVar17 * auVar104._8_4_ |
                       (uint)!bVar17 *
                       ((uint)bVar22 * auVar154._8_4_ | (uint)!bVar22 * auVar189._8_4_);
        local_460[3] = (uint)bVar19 * auVar104._12_4_ |
                       (uint)!bVar19 *
                       ((uint)bVar39 * auVar154._12_4_ | (uint)!bVar39 * auVar189._12_4_);
        uStack_450 = (uint)bVar20 * auVar104._16_4_ |
                     (uint)!bVar20 *
                     ((uint)bVar26 * auVar154._16_4_ | (uint)!bVar26 * auVar189._16_4_);
        uStack_44c = (uint)bVar23 * auVar104._20_4_ |
                     (uint)!bVar23 *
                     ((uint)bVar34 * auVar154._20_4_ | (uint)!bVar34 * auVar189._20_4_);
        uStack_448 = (uint)bVar30 * auVar104._24_4_ |
                     (uint)!bVar30 *
                     ((uint)bVar43 * auVar154._24_4_ | (uint)!bVar43 * auVar189._24_4_);
        uStack_444 = (uint)(bVar77 >> 7) * auVar104._28_4_ |
                     (uint)!(bool)(bVar77 >> 7) *
                     ((uint)bVar52 * auVar154._28_4_ | (uint)!bVar52 * auVar189._28_4_);
        pSVar10 = context->scene;
        auVar104 = vblendmps_avx512vl(auVar184._0_32_,local_4c0);
        auVar132._4_4_ = (uint)(bVar89 >> 1 & 1) * auVar104._4_4_;
        auVar132._0_4_ = (uint)(bVar89 & 1) * auVar104._0_4_;
        auVar132._8_4_ = (uint)(bVar89 >> 2 & 1) * auVar104._8_4_;
        auVar132._12_4_ = (uint)(bVar89 >> 3 & 1) * auVar104._12_4_;
        auVar132._16_4_ = (uint)(bVar89 >> 4 & 1) * auVar104._16_4_;
        auVar132._20_4_ = (uint)(bVar89 >> 5 & 1) * auVar104._20_4_;
        auVar132._24_4_ = (uint)(bVar89 >> 6 & 1) * auVar104._24_4_;
        auVar132._28_4_ = (uint)(bVar89 >> 7) * auVar104._28_4_;
        auVar104 = vshufps_avx(auVar132,auVar132,0xb1);
        auVar104 = vminps_avx(auVar132,auVar104);
        auVar105 = vshufpd_avx(auVar104,auVar104,5);
        auVar104 = vminps_avx(auVar104,auVar105);
        auVar105 = vpermpd_avx2(auVar104,0x4e);
        auVar104 = vminps_avx(auVar104,auVar105);
        uVar71 = vcmpps_avx512vl(auVar132,auVar104,0);
        uVar91 = uVar94;
        if (((byte)uVar71 & bVar89) != 0) {
          uVar91 = (uint)((byte)uVar71 & bVar89);
        }
        uVar90 = 0;
        for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
          uVar90 = uVar90 + 1;
        }
        auVar100 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
        auVar185 = ZEXT1664(auVar100);
        auVar104 = vpcmpeqd_avx2(auVar131,auVar131);
        auVar186 = ZEXT3264(auVar104);
        local_5a0 = k;
        do {
          local_590.valid = (int *)local_5b0;
          uVar92 = uVar90 & 0xff;
          uVar91 = *(uint *)(local_a0 + (ulong)uVar92 * 4);
          pGVar11 = (pSVar10->geometries).items[uVar91].ptr;
          auVar104 = auVar132;
          if ((pGVar11->mask & *(uint *)(ray + local_5a0 * 4 + 0x90)) == 0) {
            uVar94 = (uint)(byte)(~(byte)(1 << (uVar90 & 0x1f)) & (byte)uVar94);
LAB_01ce9fe0:
            bVar14 = true;
          }
          else {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              uVar97 = (ulong)(uVar92 * 4);
              local_400 = *(undefined4 *)((long)local_500 + uVar97);
              local_3f0 = *(undefined4 *)(local_4e0 + uVar97);
              local_3d0 = vpbroadcastd_avx512vl();
              uVar4 = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar97);
              local_3e0._4_4_ = uVar4;
              local_3e0._0_4_ = uVar4;
              local_3e0._8_4_ = uVar4;
              local_3e0._12_4_ = uVar4;
              uVar4 = *(undefined4 *)((long)local_4a0 + uVar97);
              uVar5 = *(undefined4 *)((long)local_480 + uVar97);
              local_420._4_4_ = uVar5;
              local_420._0_4_ = uVar5;
              local_420._8_4_ = uVar5;
              local_420._12_4_ = uVar5;
              uVar5 = *(undefined4 *)((long)local_460 + uVar97);
              local_410._4_4_ = uVar5;
              local_410._0_4_ = uVar5;
              local_410._8_4_ = uVar5;
              local_410._12_4_ = uVar5;
              local_430[0] = (RTCHitN)(char)uVar4;
              local_430[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
              local_430[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
              local_430[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
              local_430[4] = (RTCHitN)(char)uVar4;
              local_430[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
              local_430[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
              local_430[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
              local_430[8] = (RTCHitN)(char)uVar4;
              local_430[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
              local_430[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
              local_430[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
              local_430[0xc] = (RTCHitN)(char)uVar4;
              local_430[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
              local_430[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
              local_430[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
              uStack_3fc = local_400;
              uStack_3f8 = local_400;
              uStack_3f4 = local_400;
              uStack_3ec = local_3f0;
              uStack_3e8 = local_3f0;
              uStack_3e4 = local_3f0;
              uStack_3bc = context->user->instID[0];
              local_3c0 = uStack_3bc;
              uStack_3b8 = uStack_3bc;
              uStack_3b4 = uStack_3bc;
              uStack_3b0 = context->user->instPrimID[0];
              uStack_3ac = uStack_3b0;
              uStack_3a8 = uStack_3b0;
              uStack_3a4 = uStack_3b0;
              local_520._0_4_ = *(undefined4 *)(ray + local_5a0 * 4 + 0x80);
              *(undefined4 *)(ray + local_5a0 * 4 + 0x80) = *(undefined4 *)(local_4c0 + uVar97);
              local_5b0 = auVar185._0_16_;
              local_590.geometryUserPtr = pGVar11->userPtr;
              local_590.context = context->user;
              local_590.hit = local_430;
              local_590.N = 4;
              local_540 = auVar166._0_32_;
              _local_560 = local_5b0;
              local_590.ray = (RTCRayN *)ray;
              if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar104 = ZEXT1632(auVar186._0_16_);
                (*pGVar11->intersectionFilterN)(&local_590);
                auVar104 = vpcmpeqd_avx2(auVar104,auVar104);
                auVar186 = ZEXT3264(auVar104);
                auVar185 = ZEXT1664(_local_560);
                auVar166 = ZEXT3264(local_540);
                auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar184 = ZEXT3264(auVar104);
              }
              uVar97 = vptestmd_avx512vl(local_5b0,local_5b0);
              if ((uVar97 & 0xf) == 0) {
LAB_01cea2cf:
                auVar104 = ZEXT432((uint)local_520._0_4_);
                *(undefined4 *)(ray + local_5a0 * 4 + 0x80) = local_520._0_4_;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar104 = ZEXT1632(auVar186._0_16_);
                  (*p_Var13)(&local_590);
                  auVar104 = vpcmpeqd_avx2(auVar104,auVar104);
                  auVar186 = ZEXT3264(auVar104);
                  auVar185 = ZEXT1664(_local_560);
                  auVar166 = ZEXT3264(local_540);
                  auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar184 = ZEXT3264(auVar104);
                }
                uVar97 = vptestmd_avx512vl(local_5b0,local_5b0);
                uVar97 = uVar97 & 0xf;
                bVar89 = (byte)uVar97;
                if (bVar89 == 0) goto LAB_01cea2cf;
                iVar99 = *(int *)(local_590.hit + 4);
                iVar133 = *(int *)(local_590.hit + 8);
                iVar134 = *(int *)(local_590.hit + 0xc);
                bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar97 >> 2) & 1);
                bVar16 = SUB81(uVar97 >> 3,0);
                *(uint *)(local_590.ray + 0xc0) =
                     (uint)(bVar89 & 1) * *(int *)local_590.hit |
                     (uint)!(bool)(bVar89 & 1) * *(int *)(local_590.ray + 0xc0);
                *(uint *)(local_590.ray + 0xc4) =
                     (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_590.ray + 0xc4);
                *(uint *)(local_590.ray + 200) =
                     (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_590.ray + 200);
                *(uint *)(local_590.ray + 0xcc) =
                     (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_590.ray + 0xcc);
                iVar99 = *(int *)(local_590.hit + 0x14);
                iVar133 = *(int *)(local_590.hit + 0x18);
                iVar134 = *(int *)(local_590.hit + 0x1c);
                bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar97 >> 2) & 1);
                bVar16 = SUB81(uVar97 >> 3,0);
                *(uint *)(local_590.ray + 0xd0) =
                     (uint)(bVar89 & 1) * *(int *)(local_590.hit + 0x10) |
                     (uint)!(bool)(bVar89 & 1) * *(int *)(local_590.ray + 0xd0);
                *(uint *)(local_590.ray + 0xd4) =
                     (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_590.ray + 0xd4);
                *(uint *)(local_590.ray + 0xd8) =
                     (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_590.ray + 0xd8);
                *(uint *)(local_590.ray + 0xdc) =
                     (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_590.ray + 0xdc);
                iVar99 = *(int *)(local_590.hit + 0x24);
                iVar133 = *(int *)(local_590.hit + 0x28);
                iVar134 = *(int *)(local_590.hit + 0x2c);
                bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar97 >> 2) & 1);
                bVar16 = SUB81(uVar97 >> 3,0);
                *(uint *)(local_590.ray + 0xe0) =
                     (uint)(bVar89 & 1) * *(int *)(local_590.hit + 0x20) |
                     (uint)!(bool)(bVar89 & 1) * *(int *)(local_590.ray + 0xe0);
                *(uint *)(local_590.ray + 0xe4) =
                     (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_590.ray + 0xe4);
                *(uint *)(local_590.ray + 0xe8) =
                     (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_590.ray + 0xe8);
                *(uint *)(local_590.ray + 0xec) =
                     (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_590.ray + 0xec);
                iVar99 = *(int *)(local_590.hit + 0x34);
                iVar133 = *(int *)(local_590.hit + 0x38);
                iVar134 = *(int *)(local_590.hit + 0x3c);
                bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar97 >> 2) & 1);
                bVar16 = SUB81(uVar97 >> 3,0);
                *(uint *)(local_590.ray + 0xf0) =
                     (uint)(bVar89 & 1) * *(int *)(local_590.hit + 0x30) |
                     (uint)!(bool)(bVar89 & 1) * *(int *)(local_590.ray + 0xf0);
                *(uint *)(local_590.ray + 0xf4) =
                     (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_590.ray + 0xf4);
                *(uint *)(local_590.ray + 0xf8) =
                     (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_590.ray + 0xf8);
                *(uint *)(local_590.ray + 0xfc) =
                     (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_590.ray + 0xfc);
                iVar99 = *(int *)(local_590.hit + 0x44);
                iVar133 = *(int *)(local_590.hit + 0x48);
                iVar134 = *(int *)(local_590.hit + 0x4c);
                bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar97 >> 2) & 1);
                bVar16 = SUB81(uVar97 >> 3,0);
                *(uint *)(local_590.ray + 0x100) =
                     (uint)(bVar89 & 1) * *(int *)(local_590.hit + 0x40) |
                     (uint)!(bool)(bVar89 & 1) * *(int *)(local_590.ray + 0x100);
                *(uint *)(local_590.ray + 0x104) =
                     (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_590.ray + 0x104);
                *(uint *)(local_590.ray + 0x108) =
                     (uint)bVar15 * iVar133 | (uint)!bVar15 * *(int *)(local_590.ray + 0x108);
                *(uint *)(local_590.ray + 0x10c) =
                     (uint)bVar16 * iVar134 | (uint)!bVar16 * *(int *)(local_590.ray + 0x10c);
                auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50));
                *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar100;
                auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60));
                *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar100;
                auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70));
                *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar100;
                auVar104 = ZEXT1632(*(undefined1 (*) [16])(local_590.hit + 0x80));
                auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80));
                *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar100;
              }
              uVar4 = *(undefined4 *)(ray + local_5a0 * 4 + 0x80);
              auVar79._4_4_ = uVar4;
              auVar79._0_4_ = uVar4;
              auVar79._8_4_ = uVar4;
              auVar79._12_4_ = uVar4;
              auVar79._16_4_ = uVar4;
              auVar79._20_4_ = uVar4;
              auVar79._24_4_ = uVar4;
              auVar79._28_4_ = uVar4;
              uVar71 = vcmpps_avx512vl(auVar166._0_32_,auVar79,2);
              uVar94 = (uint)(byte)(~(byte)(1 << (uVar90 & 0x1f)) & (byte)uVar94) & (uint)uVar71;
              goto LAB_01ce9fe0;
            }
            bVar14 = false;
          }
          if (!bVar14) {
            uVar97 = (ulong)(uVar92 << 2);
            uVar4 = *(undefined4 *)((long)local_500 + uVar97);
            uVar5 = *(undefined4 *)(local_4e0 + uVar97);
            *(undefined4 *)(ray + local_5a0 * 4 + 0x80) = *(undefined4 *)(local_4c0 + uVar97);
            *(undefined4 *)(ray + local_5a0 * 4 + 0xc0) = *(undefined4 *)((long)local_4a0 + uVar97);
            *(undefined4 *)(ray + local_5a0 * 4 + 0xd0) = *(undefined4 *)((long)local_480 + uVar97);
            *(undefined4 *)(ray + local_5a0 * 4 + 0xe0) = *(undefined4 *)((long)local_460 + uVar97);
            *(undefined4 *)(ray + local_5a0 * 4 + 0xf0) = uVar4;
            *(undefined4 *)(ray + local_5a0 * 4 + 0x100) = uVar5;
            *(undefined4 *)(ray + local_5a0 * 4 + 0x110) =
                 *(undefined4 *)((long)&(line->primIDs).field_0 + uVar97);
            *(uint *)(ray + local_5a0 * 4 + 0x120) = uVar91;
            *(uint *)(ray + local_5a0 * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + local_5a0 * 4 + 0x140) = context->user->instPrimID[0];
            return;
          }
          bVar89 = (byte)uVar94;
          if (bVar89 == 0) {
            return;
          }
          auVar105 = vblendmps_avx512vl(auVar184._0_32_,auVar166._0_32_);
          auVar132._0_4_ =
               (uint)(bVar89 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar89 & 1) * auVar104._0_4_;
          bVar14 = (bool)((byte)(uVar94 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar104._4_4_;
          bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar104._8_4_;
          bVar14 = (bool)((byte)(uVar94 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar104._12_4_;
          bVar14 = (bool)((byte)(uVar94 >> 4) & 1);
          auVar132._16_4_ = (uint)bVar14 * auVar105._16_4_ | (uint)!bVar14 * auVar104._16_4_;
          bVar14 = (bool)((byte)(uVar94 >> 5) & 1);
          auVar132._20_4_ = (uint)bVar14 * auVar105._20_4_ | (uint)!bVar14 * auVar104._20_4_;
          bVar14 = (bool)((byte)(uVar94 >> 6) & 1);
          auVar132._24_4_ = (uint)bVar14 * auVar105._24_4_ | (uint)!bVar14 * auVar104._24_4_;
          auVar132._28_4_ =
               (uVar94 >> 7) * auVar105._28_4_ | (uint)!SUB41(uVar94 >> 7,0) * auVar104._28_4_;
          auVar104 = vshufps_avx(auVar132,auVar132,0xb1);
          auVar104 = vminps_avx(auVar132,auVar104);
          auVar105 = vshufpd_avx(auVar104,auVar104,5);
          auVar104 = vminps_avx(auVar104,auVar105);
          auVar105 = vpermpd_avx2(auVar104,0x4e);
          auVar104 = vminps_avx(auVar104,auVar105);
          uVar71 = vcmpps_avx512vl(auVar132,auVar104,0);
          bVar89 = (byte)uVar71 & bVar89;
          uVar91 = uVar94;
          if (bVar89 != 0) {
            uVar91 = (uint)bVar89;
          }
          uVar90 = 0;
          for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
            uVar90 = uVar90 + 1;
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }